

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O3

void parout(void)

{
  short *psVar1;
  char cVar2;
  uint uVar3;
  Symbol *pSVar4;
  ushort uVar5;
  bool bVar6;
  Item *item;
  uint uVar22;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  Symbol *pSVar11;
  Item *pIVar12;
  Item *pIVar13;
  Item *pIVar14;
  global_variable_t *pgVar15;
  List *pLVar16;
  List *pLVar17;
  char *pcVar18;
  List **ppLVar19;
  global_variable_t *pgVar20;
  short sVar21;
  Symbol *s;
  ulong uVar23;
  char *pcVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  ulong local_d8;
  ulong local_c0;
  double d1_1;
  double d2;
  Item *local_a8;
  double d2_1;
  double d1;
  
  cvode_emit = 0;
  defs_list = newlist();
  pcVar18 = "nrn_cur, NULL, nrn_state";
  if (vectorize == 0) {
    pcVar18 = "nrn_cur, nrn_jacob, nrn_state";
  }
  brkpnt_str_ = "NULL, NULL, NULL";
  if (brkpnt_exists != 0) {
    brkpnt_str_ = pcVar18;
  }
  set_suffix();
  iVar7 = artificial_cell;
  if (((artificial_cell != 0) && (vectorize != 0)) &&
     ((thread_data_index != 0 || (iVar7 = 1, toplocal_ != (List *)0x0)))) {
    parout_cold_1();
    iVar7 = d1._0_4_;
  }
  pIVar12 = net_receive_block_begin_;
  rsuffix = "";
  if (point_process == 0) {
    rsuffix = suffix;
  }
  else if ((iVar7 == 0) && (net_receive_ != 0)) {
    net_receive_buffering_ = 1;
    insertstr(net_receive_block_begin_,"\n#if NET_RECEIVE_BUFFERING");
    memcpy(buf,
           "\n#undef t\n#define t _nrb_t\nstatic inline void _net_receive_kernel(NrnThread*, double, Point_process*, int _weight_index, double _flag);\nvoid _net_buf_receive(NrnThread* _nt) {\n  if (!_nt->_ml_list) { return; }\n  Memb_list* _ml = _nt->_ml_list[_mechtype];\n  if (!_ml) { return; }\n  NetReceiveBuffer_t* _nrb = _ml->_net_receive_buffer;"
           ,0x14e);
    insertstr(pIVar12,buf);
    sprintf(buf,
            "\n  int _di;\n  int stream_id = _nt->stream_id;\n  Point_process* _pnt = _nt->pntprocs;\n  int _pnt_length = _nt->n_pntproc - _nrb->_pnt_offset;\n  int _displ_cnt = _nrb->_displ_cnt;\n  _PRAGMA_FOR_NETRECV_ACC_LOOP_ \n  for (_di = 0; _di < _displ_cnt; ++_di) {\n    int _inrb;\n    int _di0 = _nrb->_displ[_di];\n    int _di1 = _nrb->_displ[_di + 1];\n    for (_inrb = _di0; _inrb < _di1; ++_inrb) {\n      int _i = _nrb->_nrb_index[_inrb];\n      int _j = _nrb->_pnt_index[_i];\n      int _k = _nrb->_weight_index[_i];\n      double _nrt = _nrb->_nrb_t[_i];\n      double _nrflag = _nrb->_nrb_flag[_i];\n      _net_receive_kernel(nrn_threads, _nrt, _pnt + _j, _k, _nrflag);\n    }\n  }\n  #pragma acc wait(stream_id)\n  _nrb->_displ_cnt = 0;\n  _nrb->_cnt = 0;\n  /*printf(\"_net_buf_receive_%s  %%d\\n\", _nt->_id);*/\n"
            ,suffix);
    insertstr(pIVar12,buf);
    if (net_event_seen_ != 0 || net_send_seen_ != 0) {
      memcpy(buf,
             "\n  {\n  NetSendBuffer_t* _nsb = _ml->_net_send_buffer;\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n  #pragma acc update self(_nsb->_cnt) if(_nt->compute_gpu)\n  update_net_send_buffer_on_host(_nt, _nsb);\n#endif\n  int _i;\n  for (_i=0; _i < _nsb->_cnt; ++_i) {\n    net_sem_from_gpu(_nsb->_sendtype[_i], _nsb->_vdata_index[_i],\n      _nsb->_weight_index[_i], _nt->_id, _nsb->_pnt_index[_i],\n      _nsb->_nsb_t[_i], _nsb->_nsb_flag[_i]);\n  }\n  _nsb->_cnt = 0;\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n  #pragma acc update device(_nsb->_cnt) if (_nt->compute_gpu)\n#endif\n  }\n"
             ,0x24a);
      insertstr(pIVar12,buf);
    }
    insertstr(pIVar12,"\n}\n");
    if (net_event_seen_ != 0 || net_send_seen_ != 0) {
      memcpy(buf,
             "\nstatic void _net_send_buffering(NetSendBuffer_t* _nsb, int _sendtype, int _i_vdata, int _weight_index,\n int _ipnt, double _t, double _flag) {\n  int _i = 0;\n  #pragma acc atomic capture\n  {\n    _i = _nsb->_cnt++;\n  }\n#if !defined(_OPENACC)\n  if (_i >= _nsb->_size) {\n    _nsb->grow();\n  }\n#endif\n  if (_i < _nsb->_size) {\n    _nsb->_sendtype[_i] = _sendtype;\n    _nsb->_vdata_index[_i] = _i_vdata;\n    _nsb->_weight_index[_i] = _weight_index;\n    _nsb->_pnt_index[_i] = _ipnt;\n    _nsb->_nsb_t[_i] = _t;\n    _nsb->_nsb_flag[_i] = _flag;\n  }\n}\n"
             ,0x220);
      insertstr(pIVar12,buf);
    }
    memcpy(buf,
           "\nvoid _net_receive (Point_process* _pnt, int _weight_index, double _lflag) {\n  NrnThread* _nt = nrn_threads + _pnt->_tid;\n  NetReceiveBuffer_t* _nrb = _nt->_ml_list[_mechtype]->_net_receive_buffer;\n  if (_nrb->_cnt >= _nrb->_size){\n    realloc_net_receive_buffer(_nt, _nt->_ml_list[_mechtype]);\n  }\n  _nrb->_pnt_index[_nrb->_cnt] = _pnt - _nt->pntprocs;\n  _nrb->_weight_index[_nrb->_cnt] = _weight_index;\n  _nrb->_nrb_t[_nrb->_cnt] = _nt->_t;\n  _nrb->_nrb_flag[_nrb->_cnt] = _lflag;\n  ++_nrb->_cnt;\n}\n"
           ,0x1f6);
    insertstr(pIVar12,buf);
    memcpy(buf,
           "\nstatic void _net_receive_kernel(NrnThread* nrn_threads, double _nrb_t, Point_process* _pnt, int _weight_index, double _lflag)\n#else\n"
           ,0x86);
    insertstr(pIVar12,buf);
    insertstr(net_receive_block_open_brace_,"\n#endif\n");
  }
  lappendstr(defs_list,
             "\n#include \"coreneuron/utils/randoms/nrnran123.h\"\n#include \"coreneuron/nrnoc/md1redef.h\"\n#include \"coreneuron/nrnconf.h\"\n#include \"coreneuron/sim/multicore.hpp\"\n#include \"coreneuron/nrniv/nrniv_decl.h\"\n#include \"coreneuron/utils/ivocvect.hpp\"\n#include \"coreneuron/utils/nrnoc_aux.hpp\"\n#include \"coreneuron/gpu/nrn_acc_manager.hpp\"\n#include \"coreneuron/sim/scopmath/newton_struct.h\"\n#include \"coreneuron/sim/scopmath/newton_thread.hpp\"\n#include \"coreneuron/sim/scopmath/sparse_thread.hpp\"\n#include \"coreneuron/sim/scopmath/ssimplic_thread.hpp\"\n#include \"coreneuron/nrnoc/md2redef.h\"\n#include \"coreneuron/mechanism/register_mech.hpp\"\n#if !NRNGPU\n#if !defined(DISABLE_HOC_EXP)\n#undef exp\n#define exp hoc_Exp\n#endif\n#endif\n"
            );
  if (use_bbcorepointer == '\x01') {
    lappendstr(defs_list,
               "#define _threadargsproto_namespace int _iml, int _cntml_padded, double* _p, coreneuron::Datum* _ppvar, coreneuron::ThreadDatum* _thread, coreneuron::NrnThread* _nt, coreneuron::Memb_list* _ml, double v\n"
              );
    lappendstr(defs_list,
               "static void bbcore_read(double *, int*, int*, int*, _threadargsproto_namespace);\n")
    ;
    lappendstr(defs_list,
               "static void bbcore_write(double *, int*, int*, int*, _threadargsproto_namespace);\n"
              );
  }
  lappendstr(defs_list,"namespace coreneuron {\n");
  if (vectorize == 0) {
    local_a8 = lappendstr(defs_list,"\n#undef LAYOUT\n#define LAYOUT 1\n#define _STRIDE 1\n");
  }
  else {
    lappendstr(defs_list,
               "\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n#include <openacc.h>\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], nrn_ion_global_map[0:nrn_ion_global_map_size][0:ion_global_map_member_size], _nt[0:1] _thread_present_) if(_nt->compute_gpu)\")\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _nt[0:1], _ml[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_shadow_rhs[0:_nt->shadow_rhs_cnt], _vec_shadow_d[0:_nt->shadow_rhs_cnt], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1]) if(_nt->compute_gpu) async(stream_id)\")\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"acc parallel loop present(_pnt[0:_pnt_length], _nrb[0:1], _nt[0:1], nrn_threads[0:nrn_nthread]) if(_nt->compute_gpu) async(stream_id)\")\n#else\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"\")\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"\")\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"\")\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"\")\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"\")\n#endif\n \n#if !defined(LAYOUT)\n/* 1 means AoS, >1 means AoSoA, <= 0 means SOA */\n#define LAYOUT 1\n#endif\n#if LAYOUT >= 1\n#define _STRIDE LAYOUT\n#else\n#define _STRIDE _cntml_padded + _iml\n#endif\n"
              );
    if (protect_include_ == 0) {
      pcVar18 = 
      "\n\n#if defined(__ICC) || defined(__INTEL_COMPILER) || defined(__INTEL_LLVM_COMPILER)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ivdep\")\n#elif defined(__IBMC__) || defined(__IBMCPP__)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ibm independent_loop\")\n#elif defined(__PGI)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"vector\")\n#elif defined(_CRAYC)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"_CRI ivdep\")\n#elif defined(__clang__)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"clang loop vectorize(enable)\")\n#elif defined(__GNUC__) || defined(__GNUG__)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"GCC ivdep\")\n#else\n#define _PRAGMA_FOR_VECTOR_LOOP_\n#endif // _PRAGMA_FOR_VECTOR_LOOP_\n"
      ;
    }
    else {
      pcVar18 = "\n#define _PRAGMA_FOR_VECTOR_LOOP_\n";
    }
    local_a8 = insertstr(defs_list,pcVar18);
  }
  if (net_receive_buffering_ != 0) {
    lappendstr(defs_list,
               "\n\n#if !defined(NET_RECEIVE_BUFFERING)\n#define NET_RECEIVE_BUFFERING 1\n#endif\n")
    ;
  }
  sprintf(buf,
          "\n#define nrn_init _nrn_init_%s\n#define nrn_cur _nrn_cur_%s\n#define _nrn_current _nrn_current_%s\n#define nrn_jacob _nrn_jacob_%s\n#define nrn_state _nrn_state_%s\n#define initmodel initmodel_%s\n#define _net_receive _net_receive_%s\n#define _net_init _net_init_%s\n#define nrn_state_launcher nrn_state%s_launcher\n#define nrn_cur_launcher nrn_cur%s_launcher\n#define nrn_jacob_launcher nrn_jacob%s_launcher"
          ,suffix,suffix,suffix,suffix,suffix,suffix,suffix,suffix,suffix,suffix,suffix);
  lappendstr(defs_list,buf);
  if (net_receive_buffering_ != 0) {
    sprintf(buf,
            "\n#if NET_RECEIVE_BUFFERING\n#define _net_buf_receive _net_buf_receive%s\nvoid _net_buf_receive(NrnThread*);\n#endif\n"
            ,suffix);
    lappendstr(defs_list,buf);
  }
  if (watch_seen_ != 0) {
    sprintf(buf,"\n#define _nrn_watch_check _nrn_watch_check_%s",suffix);
    lappendstr(defs_list,buf);
  }
  lVar25 = 0x41;
  do {
    pLVar17 = symlist[lVar25];
    for (pLVar16 = pLVar17->next; pLVar16 != pLVar17; pLVar16 = pLVar16->next) {
      pIVar12 = (pLVar16->element).itm;
      if ((pIVar12->itemtype == 0x13e) && (((ulong)pIVar12->element & 0x680) != 0)) {
        sprintf(buf,"\n#define %s %s%s",pIVar12[2].element.itm);
        lappendstr(defs_list,buf);
        pLVar17 = symlist[lVar25];
      }
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x7b);
  lappendstr(defs_list,"\n");
  lappendstr(defs_list,
             "\n#undef _threadargscomma_\n#undef _threadargsprotocomma_\n#undef _threadargs_\n#undef _threadargsproto_\n"
            );
  pcVar18 = 
  "\n#define _threadargscomma_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v,\n#define _threadargsprotocomma_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v,\n#define _threadargs_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v\n#define _threadargsproto_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v\n"
  ;
  if (vectorize == 0) {
    pcVar18 = 
    "\n#define _threadargscomma_ /**/\n#define _threadargsprotocomma_ /**/\n#define _threadargs_ /**/\n#define _threadargsproto_ /**/\n"
    ;
  }
  lappendstr(defs_list,pcVar18);
  lappendstr(defs_list,
             "\t/*SUPPRESS 761*/\n\t/*SUPPRESS 762*/\n\t/*SUPPRESS 763*/\n\t/*SUPPRESS 765*/\n\t");
  if (vectorize == 0) {
    builtin_strncpy(buf + 0x20,"*_ppvar;\n",10);
    buf[0x10] = 'p';
    buf[0x11] = ';';
    builtin_strncpy(buf + 0x1a,"Datum ",6);
    uVar31._0_1_ = 's';
    uVar31._1_1_ = 't';
    uVar31._2_1_ = 'a';
    uVar31._3_1_ = 't';
    uVar32._0_1_ = 'i';
    uVar32._1_1_ = 'c';
    uVar32._2_1_ = ' ';
    uVar32._3_1_ = 'd';
    uVar33._0_1_ = 'o';
    uVar33._1_1_ = 'u';
    uVar33._2_1_ = 'b';
    uVar33._3_1_ = 'l';
    uVar34._0_1_ = 'e';
    uVar34._1_1_ = ' ';
    uVar34._2_1_ = '*';
    uVar34._3_1_ = '_';
  }
  else {
    builtin_strncpy(buf + 0x20,"_ppvar. */\n",0xc);
    buf[0x10] = 'N';
    buf[0x11] = 'o';
    builtin_strncpy(buf + 0x1a,"_p or ",6);
    uVar31._0_1_ = '/';
    uVar31._1_1_ = '*';
    uVar31._2_1_ = ' ';
    uVar31._3_1_ = 'T';
    uVar32._0_1_ = 'h';
    uVar32._1_1_ = 'r';
    uVar32._2_1_ = 'e';
    uVar32._3_1_ = 'a';
    uVar33._0_1_ = 'd';
    uVar33._1_1_ = ' ';
    uVar33._2_1_ = 's';
    uVar33._3_1_ = 'a';
    uVar34._0_1_ = 'f';
    uVar34._1_1_ = 'e';
    uVar34._2_1_ = '.';
    uVar34._3_1_ = ' ';
  }
  builtin_strncpy(buf + 0x12," static ",8);
  buf[4] = (char)uVar32;
  buf[5] = SUB41(uVar32,1);
  buf[6] = SUB41(uVar32,2);
  buf[7] = SUB41(uVar32,3);
  buf[0] = (char)uVar31;
  buf[1] = SUB41(uVar31,1);
  buf[2] = SUB41(uVar31,2);
  buf[3] = SUB41(uVar31,3);
  buf._8_2_ = (undefined2)uVar33;
  buf._10_2_ = SUB42(uVar33,2);
  buf._12_2_ = (undefined2)uVar34;
  buf._14_2_ = SUB42(uVar34,2);
  lappendstr(defs_list,buf);
  pSVar11 = lookup("diam");
  if (pSVar11 != (Symbol *)0x0) {
    if ((pSVar11->nrntype & 0x48U) != 0) {
      diag(pSVar11->name," cannot be a RANGE or GLOBAL variable for this mechanism");
    }
    pSVar11->nrntype = pSVar11->nrntype | 0x110;
    diamdec = 1;
  }
  pSVar11 = lookup("area");
  if (pSVar11 != (Symbol *)0x0) {
    if ((pSVar11->nrntype & 0x48U) != 0) {
      diag(pSVar11->name," cannot be a RANGE or GLOBAL variable for this mechanism");
    }
    pSVar11->nrntype = pSVar11->nrntype | 0x110;
    areadec = 1;
  }
  iVar7 = vectorize;
  pSVar11 = lookup("v");
  if (iVar7 == 0) {
    if (pSVar11 == (Symbol *)0x0) {
      pSVar11 = install("v",0x13e);
      parminstall(pSVar11,"0","","");
    }
    pSVar11->nrntype = pSVar11->nrntype | 0x180;
  }
  else {
    if (pSVar11 == (Symbol *)0x0) {
      pSVar11 = install("v",0x13e);
      parminstall(pSVar11,"0","","");
    }
    pSVar11->nrntype = 0x100;
  }
  pSVar11 = lookup("t");
  if (pSVar11 == (Symbol *)0x0) {
    pSVar11 = install("t",0x13e);
    parminstall(pSVar11,"0","","");
  }
  pSVar11->nrntype = pSVar11->nrntype | 0x101;
  pSVar11 = lookup("dt");
  if (pSVar11 == (Symbol *)0x0) {
    pSVar11 = install("dt",0x13e);
    parminstall(pSVar11,"0","","");
  }
  pSVar11->nrntype = pSVar11->nrntype | 0x101;
  pIVar12 = lappendstr(defs_list,"\n#define t nrn_threads->_t\n#define dt nrn_threads->_dt\n");
  vectorize_substitute(pIVar12,"\n#define t _nt->_t\n#define dt _nt->_dt\n");
  pSVar11 = lookup("usetable");
  if (pSVar11 != (Symbol *)0x0) {
    pSVar11->nrntype = pSVar11->nrntype | 0x140;
  }
  pSVar11 = lookup("celsius");
  if (pSVar11 != (Symbol *)0x0) {
    pSVar11->nrntype = pSVar11->nrntype | 0x101;
  }
  pSVar11 = lookup("celcius");
  if (pSVar11 != (Symbol *)0x0) {
    diag("celcius should be spelled celsius",(char *)0x0);
  }
  pIVar12 = syminorder->next;
  if (pIVar12 != syminorder) {
    do {
      pSVar11 = (pIVar12->element).sym;
      if ((pSVar11->type & 0xfffeU) == 0x13e) {
        uVar23 = pSVar11->subtype;
        if (((uVar23 & 2) == 0) || (ppLVar19 = &rangeparm, (pSVar11->nrntype & 8) == 0)) {
          if ((uVar23 & 0x10) != 0) {
            *(byte *)&pSVar11->nrntype = (byte)pSVar11->nrntype | 8;
            ppLVar19 = &rangestate;
            goto LAB_00106156;
          }
          if (((uVar23 & 8) != 0) && (ppLVar19 = &rangedep, (pSVar11->nrntype & 8) != 0))
          goto LAB_00106156;
        }
        else {
LAB_00106156:
          lappendsym(*ppLVar19,pSVar11);
        }
        if (((pSVar11 != indepsym) && (pSVar11->nrntype == 0)) && ((pSVar11->subtype & 2) != 0)) {
          pSVar11->nrntype = (ushort)((pSVar11->usage & 1) == 0) * 0x40 + 0x140;
        }
      }
      pIVar12 = pIVar12->next;
    } while (pIVar12 != syminorder);
  }
  pLVar16 = rangeparm;
  pIVar12 = rangeparm->next;
  pIVar14 = rangestate;
  while (pIVar13 = pIVar12, rangestate = pIVar14, pIVar13 != pLVar16) {
    pIVar12 = pIVar13->next;
    if (((ulong)((pIVar13->element).itm)->next & 0x30) != 0) {
      delete(pIVar13);
      pIVar14 = rangestate;
    }
  }
  pIVar12 = pIVar14->next;
  pIVar13 = rangedep;
  while (item = pIVar12, rangedep = pIVar13, item != pIVar14) {
    pIVar12 = item->next;
    if (((ulong)((item->element).itm)->next & 0x30) != 0) {
      delete(item);
      pIVar13 = rangedep;
    }
  }
  pIVar12 = pIVar13->next;
  pLVar16 = syminorder;
  while (pIVar14 = pIVar12, syminorder = pLVar16, pIVar14 != pIVar13) {
    pIVar12 = pIVar14->next;
    if (((ulong)((pIVar14->element).itm)->next & 0x30) != 0) {
      delete(pIVar14);
      pLVar16 = syminorder;
    }
  }
  parraycount = 0;
  varcount = 0;
  for (pLVar17 = pLVar16->next; pLVar17 != pLVar16; pLVar17 = pLVar17->next) {
    ((pLVar17->element).sym)->used = -1;
  }
  pLVar16 = rangeparm->next;
  if (pLVar16 != rangeparm) {
    do {
      var_count((pLVar16->element).sym);
      pLVar16 = pLVar16->next;
    } while (pLVar16 != rangeparm);
  }
  pLVar16 = rangedep->next;
  if (pLVar16 != rangedep) {
    do {
      var_count((pLVar16->element).sym);
      pLVar16 = pLVar16->next;
    } while (pLVar16 != rangedep);
  }
  pLVar16 = rangestate->next;
  if (pLVar16 != rangestate) {
    do {
      var_count((pLVar16->element).sym);
      pLVar16 = pLVar16->next;
    } while (pLVar16 != rangestate);
  }
  pLVar17 = syminorder;
  for (pLVar16 = syminorder->next; pLVar16 != pLVar17; pLVar16 = pLVar16->next) {
    pSVar11 = (pLVar16->element).sym;
    if (((pSVar11->nrntype & 0x100) == 0) && (pSVar11->used < 0)) {
      var_count(pSVar11);
      pLVar17 = syminorder;
    }
  }
  if (vectorize == 0) {
    iVar7 = 0;
  }
  else {
    pSVar11 = lookup("_v_unused");
    if (pSVar11 == (Symbol *)0x0) {
      pSVar11 = install("_v_unused",0x13e);
      parminstall(pSVar11,"0","","");
    }
    var_count(pSVar11);
    iVar7 = 1;
  }
  if (brkpnt_exists != 0) {
    if (vectorize == 0) {
      pcVar18 = "_g";
      pSVar11 = lookup("_g");
    }
    else {
      pcVar18 = "_g_unused";
      pSVar11 = lookup("_g_unused");
      iVar7 = 2;
    }
    if (pSVar11 == (Symbol *)0x0) {
      pSVar11 = install(pcVar18,0x13e);
      parminstall(pSVar11,"0","","");
    }
    var_count(pSVar11);
  }
  if ((debugging_ != 0) && (net_receive_ != 0)) {
    pSVar11 = lookup("_tsav");
    if (pSVar11 == (Symbol *)0x0) {
      pSVar11 = install("_tsav",0x13e);
      parminstall(pSVar11,"0","","");
    }
    var_count(pSVar11);
  }
  if (iVar7 != 0) {
    pcVar18 = "/**/";
    if (iVar7 == 2) {
      pcVar18 = "_g_unused = _g;";
    }
    sprintf(buf,
            "\n#ifndef NRN_PRCELLSTATE\n#define NRN_PRCELLSTATE 0\n#endif\n#if NRN_PRCELLSTATE\n#define _PRCELLSTATE_V _v_unused = _v;\n#define _PRCELLSTATE_G %s\n#else\n#define _PRCELLSTATE_V /**/\n#define _PRCELLSTATE_G /**/\n#endif\n"
            ,pcVar18);
    lappendstr(defs_list,buf);
  }
  if (point_process == 0) {
    local_d8 = 0;
  }
  else {
    pIVar12 = lappendstr(defs_list,"#define _nd_area  _nt_data[_ppvar[0*_STRIDE]]\n");
    pIVar12->itemtype = 0x102;
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar12 = lappendstr(ppvar_semantics_,"area");
    pIVar12->itemtype = 0;
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar12 = lappendstr(ppvar_semantics_,"pntproc");
    pIVar12->itemtype = 1;
    local_d8 = 2;
  }
  pIVar12 = useion->next;
  if (pIVar12 != useion) {
    do {
      if (uip == (List *)0x0) {
        uip = newlist();
        lappendstr(uip,"static void _update_ion_pointer(Datum* _ppvar) {\n");
      }
      pSVar11 = (pIVar12->element).sym;
      sprintf((char *)&d1,"%s_ion",pSVar11->name);
      pIVar12 = pIVar12->next;
      pIVar14 = ((pIVar12->element).itm)->next;
      if (pIVar14 != (pIVar12->element).itm) {
        do {
          psVar1 = &((pIVar14->element).sym)->nrntype;
          *psVar1 = *psVar1 | 0x200;
          sprintf(buf,"#define _ion_%s\t\t_nt_data[_ppvar[%d*_STRIDE]]\n",
                  ((pIVar14->element).sym)->name,local_d8);
          pIVar13 = lappendstr(defs_list,buf);
          pIVar13->itemtype = 0x102;
          pcVar18 = pSVar11->name;
          iontype(((pIVar14->element).sym)->name,pcVar18);
          sprintf(buf,"  nrn_update_ion_pointer(_%s_sym, _ppvar, %d, %d);\n",pcVar18);
          ((pIVar14->element).sym)->ioncount_ = (int)local_d8;
          if (ppvar_semantics_ == (List *)0x0) {
            ppvar_semantics_ = newlist();
          }
          pIVar13 = lappendstr(ppvar_semantics_,(char *)&d1);
          pIVar13->itemtype = (short)local_d8;
          local_d8 = (ulong)((int)local_d8 + 1);
          pIVar14 = pIVar14->next;
        } while (pIVar14 != (pIVar12->element).itm);
      }
      pIVar12 = pIVar12->next;
      pIVar14 = ((pIVar12->element).itm)->next;
      if (pIVar14 == (pIVar12->element).itm) {
        bVar29 = true;
      }
      else {
        bVar29 = false;
        bVar30 = false;
        do {
          pSVar4 = (pIVar14->element).sym;
          uVar22._0_2_ = pSVar4->nrntype;
          uVar22._2_2_ = pSVar4->assigned_to_;
          if ((uVar22 >> 9 & 1) == 0) {
            sprintf(buf,"#define _ion_%s\t_nt_data[_ppvar[%d*_STRIDE]]\n",pSVar4->name,local_d8);
            pIVar13 = lappendstr(defs_list,buf);
            pIVar13->itemtype = 0x102;
            pcVar18 = pSVar11->name;
            iontype(((pIVar14->element).sym)->name,pcVar18);
            sprintf(buf,"  nrn_update_ion_pointer(_%s_sym, _ppvar, %d, %d);\n",pcVar18);
            ((pIVar14->element).sym)->ioncount_ = (int)local_d8;
            if (ppvar_semantics_ == (List *)0x0) {
              ppvar_semantics_ = newlist();
            }
            pIVar13 = lappendstr(ppvar_semantics_,(char *)&d1);
            pIVar13->itemtype = (short)local_d8;
            local_d8 = (ulong)((int)local_d8 + 1);
          }
          else {
            pSVar4->nrntype = (undefined2)uVar22 & 0xfdff;
          }
          iVar7 = iontype(((pIVar14->element).sym)->name,pSVar11->name);
          if (iVar7 == 3) {
            sprintf(buf,"#define _ion_di%sdv\t_nt_data[_ppvar[%d*_STRIDE]]\n",pSVar11->name,local_d8
                   );
            pIVar13 = lappendstr(defs_list,buf);
            pIVar13->itemtype = 0x102;
            sprintf(buf,"  nrn_update_ion_pointer(_%s_sym, _ppvar, %d, 4);\n",pSVar11->name);
            if (ppvar_semantics_ == (List *)0x0) {
              ppvar_semantics_ = newlist();
            }
            pIVar13 = lappendstr(ppvar_semantics_,(char *)&d1);
            pIVar13->itemtype = (short)local_d8;
            local_d8 = (ulong)((int)local_d8 + 1);
            bVar29 = true;
          }
          if (iVar7 - 1U < 2) {
            bVar30 = true;
          }
          pIVar14 = pIVar14->next;
        } while (pIVar14 != (pIVar12->element).itm);
        bVar29 = !bVar29;
        if (bVar30) {
          sprintf(buf,"#define _style_%s\t_ppvar[%d]\n",pSVar11->name);
          pIVar14 = lappendstr(defs_list,buf);
          pIVar14->itemtype = 0x102;
          sprintf(buf,"#%s",&d1);
          if (ppvar_semantics_ == (List *)0x0) {
            ppvar_semantics_ = newlist();
          }
          pIVar14 = lappendstr(ppvar_semantics_,buf);
          pIVar14->itemtype = (short)local_d8;
          local_d8 = (ulong)((int)local_d8 + 1);
        }
      }
      pIVar12 = pIVar12->next;
      if ((bVar29) && (ldifuslist != (List *)0x0)) {
        sprintf(buf,"#define _ion_di%sdv\t_nt_data[_ppvar[%d*_STRIDE]]\n",pSVar11->name,local_d8);
        pIVar14 = lappendstr(defs_list,buf);
        pIVar14->itemtype = 0x102;
        sprintf(buf,"  nrn_update_ion_pointer(_%s_sym, _ppvar, %d, 4);\n",pSVar11->name);
        if (ppvar_semantics_ == (List *)0x0) {
          ppvar_semantics_ = newlist();
        }
        pIVar14 = lappendstr(ppvar_semantics_,(char *)&d1);
        pIVar14->itemtype = (short)local_d8;
        local_d8 = (ulong)((int)local_d8 + 1);
      }
      pIVar12 = pIVar12->next;
    } while (pIVar12 != useion);
  }
  pLVar16 = nrnpointers->next;
  iVar7 = (int)local_d8;
  if (pLVar16 == nrnpointers) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    do {
      pSVar11 = (pLVar16->element).sym;
      uVar8._0_2_ = pSVar11->nrntype;
      uVar8._2_2_ = pSVar11->assigned_to_;
      if ((uVar8 >> 0xb & 1) != 0) {
        sprintf(buf,"#define %s\t_nt->_data[_ppvar[%d*_STRIDE]]\n",pSVar11->name);
        if (ppvar_semantics_ == (List *)0x0) {
          ppvar_semantics_ = newlist();
        }
        pIVar12 = lappendstr(ppvar_semantics_,"pointer");
        pIVar12->itemtype = (short)local_d8;
        uVar8 = (uint)(ushort)pSVar11->nrntype;
      }
      iVar27 = (int)local_d8;
      if ((uVar8 >> 0xd & 1) != 0) {
        sprintf(buf,"#define _p_%s\t_nt->_vdata[_ppvar[%d*_STRIDE]]\n",pSVar11->name,local_d8);
        if (ppvar_semantics_ == (List *)0x0) {
          ppvar_semantics_ = newlist();
        }
        iVar27 = iVar9 + iVar7;
        pIVar12 = lappendstr(ppvar_semantics_,"bbcorepointer");
        pIVar12->itemtype = (short)local_d8;
      }
      pSVar11->used = iVar27;
      pIVar12 = lappendstr(defs_list,buf);
      pIVar12->itemtype = 0x102;
      iVar9 = iVar9 + 1;
      pLVar16 = pLVar16->next;
      local_d8 = (ulong)((int)local_d8 + 1);
    } while (pLVar16 != nrnpointers);
  }
  if (diamdec == 1) {
    sprintf(buf,"#define diam\t_nt->_data[_ppvar[%d*_STRIDE]]\n",(ulong)(uint)(iVar9 + iVar7));
    pIVar12 = lappendstr(defs_list,buf);
    pIVar12->itemtype = 0x102;
  }
  if (areadec == 1) {
    sprintf(buf,"#define area\t_nt->_data[_ppvar[%d*_STRIDE]]\n",
            (ulong)((uint)diamdec + iVar9 + iVar7));
    pIVar12 = lappendstr(defs_list,buf);
    pIVar12->itemtype = 0x102;
  }
  if (uip != (List *)0x0) {
    lappendstr(uip,"}\n");
  }
  lappendstr(defs_list,
             "\n#if MAC\n#if !defined(v)\n#define v _mlhv\n#endif\n#if !defined(h)\n#define h _mlhh\n#endif\n#endif\n"
            );
  lappendstr(defs_list,"static int hoc_nrnpointerindex = ");
  if (iVar9 == 0) {
    buf._4_4_ = SUB84(buf._0_8_,4) & 0xffffff00;
    builtin_strncpy(buf,"-1;\n",4);
  }
  else {
    sprintf(buf,"%d;\n",(ulong)(uint)((nrnpointers->next->element).sym)->used);
  }
  lappendstr(defs_list,buf);
  if (vectorize != 0) {
    lappendstr(defs_list,"static ThreadDatum* _extcall_thread;\n");
  }
  lappendstr(defs_list,"/* external NEURON variables */\n");
  lVar25 = 0x41;
  bVar30 = false;
  bVar29 = false;
  do {
    pLVar16 = symlist[lVar25]->next;
    if (pLVar16 != symlist[lVar25]) {
      do {
        pSVar11 = (pLVar16->element).sym;
        pcVar18 = pSVar11->name;
        iVar27 = strcmp(pcVar18,"nrn_ghk");
        if ((iVar27 == 0) && ((pSVar11->subtype & 0x8000) != 0)) {
          bVar29 = true;
          bVar30 = true;
        }
        if ((pSVar11->nrntype & 1) != 0) {
          iVar27 = strcmp(pcVar18,"celsius");
          if (iVar27 == 0) {
            bVar29 = true;
          }
          else {
            if (*pcVar18 == 't') {
              cVar2 = pcVar18[1];
joined_r0x00106c61:
              if (cVar2 == '\0') goto LAB_00106ce1;
            }
            else if ((*pcVar18 == 'd') && (pcVar18[1] == 't')) {
              cVar2 = pcVar18[2];
              goto joined_r0x00106c61;
            }
            pcVar24 = "extern double* %s;\n";
            if ((pSVar11->subtype & 0x20) == 0) {
              pcVar24 = "extern double %s;\n";
            }
            sprintf(buf,pcVar24,pcVar18);
            lappendstr(defs_list,buf);
            pcVar18 = pSVar11->name;
            iVar27 = strcmp(pcVar18,"secondorder");
            if ((((iVar27 != 0) || (*pcVar18 != 'p')) || (pcVar18[1] != 'i')) ||
               (pcVar18[2] != '\0')) {
              add_global_var("double",pcVar18,0,0,0,0);
            }
          }
        }
LAB_00106ce1:
        pLVar16 = pLVar16->next;
      } while (pLVar16 != symlist[lVar25]);
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x7b);
  if (bVar29) {
    lappendstr(defs_list,"extern double celsius;\n");
    add_global_var("double","celsius",0,0,0,0);
  }
  if (bVar30) {
    lappendstr(defs_list,"#define nrn_ghk(v, ci, co, z) nrn_ghk(v, ci, co, z, celsius)\n");
  }
  lappendstr(defs_list,"#if 0 /*BBCORE*/\n");
  lappendstr(defs_list,"/* declaration of user functions */\n");
  lVar25 = 0x41;
  do {
    pLVar17 = symlist[lVar25];
    for (pLVar16 = pLVar17->next; pLVar16 != pLVar17; pLVar16 = pLVar16->next) {
      if (((((pLVar16->element).sym)->subtype & 0xc0) != 0) &&
         (*((pLVar16->element).sym)->name != '_')) {
        pcVar18 = "static double _hoc_%s();\n";
        if (point_process == 0) {
          pcVar18 = "static void _hoc_%s(void);\n";
        }
        sprintf(buf,pcVar18);
        lappendstr(defs_list,buf);
        pLVar17 = symlist[lVar25];
      }
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x7b);
  lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  lappendstr(defs_list,"static int _mechtype;\n");
  if (point_process != 0) {
    lappendstr(defs_list,"static int _pointtype;\n");
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
    lappendstr(defs_list,
               "static void* _hoc_create_pnt(_ho) Object* _ho; { void* create_point_process();\n");
    lappendstr(defs_list,"return create_point_process(_pointtype, _ho);\n}\n");
    lappendstr(defs_list,"static void _hoc_destroy_pnt();\n");
    lappendstr(defs_list,
               "static double _hoc_loc_pnt(_vptr) void* _vptr; {double loc_point_process();\n");
    lappendstr(defs_list,"return loc_point_process(_pointtype, _vptr);\n}\n");
    lappendstr(defs_list,"static double _hoc_has_loc(_vptr) void* _vptr; {double has_loc_point();\n"
              );
    lappendstr(defs_list,"return has_loc_point(_vptr);\n}\n");
    lappendstr(defs_list,"static double _hoc_get_loc_pnt(_vptr)void* _vptr; {\n");
    lappendstr(defs_list,
               "double get_loc_point_process(); return (get_loc_point_process(_vptr));\n}\n");
    lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  }
  lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
  lappendstr(defs_list,"/* connect user functions to hoc names */\n");
  lappendstr(defs_list,"static VoidFunc hoc_intfunc[] = {\n");
  if (point_process == 0) {
    sprintf(buf,"\"setdata_%s\", _hoc_setdata,\n",mechname);
  }
  else {
    lappendstr(defs_list,"0,0\n};\n");
    lappendstr(defs_list,"static Member_func _member_func[] = {\n");
    builtin_strncpy(buf,"\"loc\", _hoc_loc_pnt,\n",0x16);
    lappendstr(defs_list,buf);
    builtin_strncpy(buf,"\"has_loc\", _hoc_has_loc,\n",0x1a);
    lappendstr(defs_list,buf);
    builtin_strncpy(buf,"\"get_loc\", _hoc_get_loc_pnt,\n",0x1e);
  }
  lappendstr(defs_list,buf);
  lVar25 = 0x41;
  do {
    pLVar17 = symlist[lVar25];
    for (pLVar16 = pLVar17->next; pLVar16 != pLVar17; pLVar16 = pLVar16->next) {
      if (((((pLVar16->element).sym)->subtype & 0xc0) != 0) &&
         (pcVar18 = ((pLVar16->element).sym)->name, *pcVar18 != '_')) {
        sprintf(buf,"\"%s%s\", _hoc_%s,\n",pcVar18,rsuffix);
        lappendstr(defs_list,buf);
        pLVar17 = symlist[lVar25];
      }
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x7b);
  lappendstr(defs_list,"0, 0\n};\n");
  lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  if (suffix[0] != '\0') {
    lVar25 = 0x41;
    do {
      pLVar17 = symlist[lVar25];
      for (pLVar16 = pLVar17->next; pLVar16 != pLVar17; pLVar16 = pLVar16->next) {
        if ((((pLVar16->element).sym)->subtype & 0x40) != 0) {
          sprintf(buf,"#define %s %s%s\n",((pLVar16->element).sym)->name);
          pIVar12 = lappendstr(defs_list,buf);
          pIVar12->itemtype = 0x102;
          pLVar17 = symlist[lVar25];
        }
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != 0x7b);
  }
  lVar25 = 0x41;
  do {
    pLVar17 = symlist[lVar25];
    for (pLVar16 = pLVar17->next; pLVar16 != pLVar17; pLVar16 = pLVar16->next) {
      pSVar11 = (pLVar16->element).sym;
      if ((pSVar11->subtype & 0x40) != 0) {
        if (artificial_cell == 0) {
          lappendstr(defs_list,"#pragma acc routine seq\n");
        }
        sprintf(buf,"inline double %s(",pSVar11->name);
        lappendstr(defs_list,buf);
        if ((vectorize != 0) && (pSVar11->no_threadargs == 0)) {
          pcVar18 = "_threadargsprotocomma_";
          if (pSVar11->varnum == 0) {
            pcVar18 = "_threadargsproto_";
          }
          lappendstr(defs_list,pcVar18);
        }
        if (0 < pSVar11->varnum) {
          iVar27 = 0;
          do {
            lappendstr(defs_list,"double");
            iVar27 = iVar27 + 1;
            iVar10 = pSVar11->varnum;
            if (iVar27 < iVar10) {
              lappendstr(defs_list,",");
              iVar10 = pSVar11->varnum;
            }
          } while (iVar27 < iVar10);
        }
        lappendstr(defs_list,");\n");
        pLVar17 = symlist[lVar25];
      }
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x7b);
  if (vectorize == 0) {
    bVar29 = true;
LAB_001074f2:
    lappendstr(defs_list,"/* declare global and static user variables */\n");
  }
  else {
    iVar27 = check_tables_threads(defs_list);
    bVar29 = iVar27 == 0;
    if (toplocal_ != (List *)0x0 && vectorize != 0) {
      uVar23 = 0;
      for (pLVar16 = toplocal_->next; pLVar16 != toplocal_; pLVar16 = pLVar16->next) {
        pSVar11 = (pLVar16->element).sym;
        if (pSVar11->assigned_to_ != 2) {
          if ((pSVar11->subtype & 0x20) == 0) {
            uVar23 = (ulong)((int)uVar23 + 1);
          }
          else {
            uVar23 = (ulong)(uint)((int)uVar23 + pSVar11->araydim);
          }
        }
      }
      sprintf(buf,"  _thread[%d]._pval = (double*)ecalloc(%d, sizeof(double));\n",
              (ulong)(uint)thread_data_index,uVar23);
      lappendstr(thread_mem_init_list,buf);
      sprintf(buf,"  free((void*)(_thread[%d]._pval));\n",(ulong)(uint)thread_data_index);
      lappendstr(thread_cleanup_list,buf);
      pIVar12 = toplocal_->next;
      if (pIVar12 != toplocal_) {
        do {
          pSVar11 = (pIVar12->element).sym;
          pcVar18 = pSVar11->name;
          if (pSVar11->assigned_to_ == 2) {
            if ((pSVar11->subtype & 0x20U) == 0) {
              sprintf(buf,"static double %s;\n",pcVar18);
            }
            else {
              sprintf(buf,"static double %s[%d];\n",pcVar18,(ulong)(uint)pSVar11->araydim);
            }
          }
          else if ((pSVar11->subtype & 0x20U) == 0) {
            sprintf(buf,"#define %s _thread[%d]._pval[%d]\n",pcVar18,(ulong)(uint)thread_data_index)
            ;
          }
          else {
            sprintf(buf,"#define %s (_thread[%d]._pval + %d)\n",pcVar18,
                    (ulong)(uint)thread_data_index);
          }
          lappendstr(defs_list,buf);
          pIVar12 = pIVar12->next;
        } while (pIVar12 != toplocal_);
      }
      thread_data_index = thread_data_index + 1;
    }
    if (vectorize == 0) goto LAB_001074f2;
    uVar22 = 0;
    lVar25 = 0x41;
    do {
      for (pLVar16 = symlist[lVar25]->next; pLVar16 != symlist[lVar25]; pLVar16 = pLVar16->next) {
        pSVar11 = (pLVar16->element).sym;
        if (((pSVar11->nrntype & 0x40) != 0) && (pSVar11->assigned_to_ == 1)) {
          if ((pSVar11->subtype & 0x20) == 0) {
            uVar22 = uVar22 + 1;
          }
          else {
            uVar22 = uVar22 + pSVar11->araydim;
          }
        }
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != 0x7b);
    lappendstr(defs_list,"/* declare global and static user variables */\n");
    if (uVar22 != 0) {
      sprintf(buf,
              "static int _thread1data_inuse = 0;\nstatic double _thread1data[%d];\n#define _gth %d\n"
              ,(ulong)uVar22,(ulong)(uint)thread_data_index);
      lappendstr(defs_list,buf);
      sprintf(buf,
              " if (_thread1data_inuse) {_thread[_gth]._pval = (double*)ecalloc(%d, sizeof(double));\n }else{\n _thread[_gth]._pval = _thread1data; _thread1data_inuse = 1;\n }\n"
              ,(ulong)uVar22);
      lappendstr(thread_mem_init_list,buf);
      lappendstr(thread_cleanup_list,
                 " if (_thread[_gth]._pval == _thread1data) {\n   _thread1data_inuse = 0;\n  }else{\n   free((void*)_thread[_gth]._pval);\n  }\n"
                );
      thread_data_index = thread_data_index + 1;
    }
  }
  globals_update_list = newlist();
  lVar25 = 0x41;
  local_c0 = 0;
  do {
    pLVar16 = symlist[lVar25]->next;
    if (pLVar16 != symlist[lVar25]) {
      do {
        pSVar11 = (pLVar16->element).sym;
        if ((pSVar11->nrntype & 0x40) != 0) {
          if ((vectorize == 0) || (pSVar11->assigned_to_ != 1)) {
            decode_ustr(pSVar11,&d1,&d2,buf);
            bVar30 = (pSVar11->subtype & 0x20) != 0;
            if (bVar30) {
              sprintf(buf,"static double %s%s[%d];\n",pSVar11->name,suffix,
                      (ulong)(uint)pSVar11->araydim);
              pcVar18 = pSVar11->name;
              iVar27 = pSVar11->araydim;
            }
            else {
              sprintf(buf,"static double %s%s = %g;\n",d1._0_4_,pSVar11->name);
              pcVar18 = pSVar11->name;
              iVar27 = 0;
            }
            add_global_var("double",pcVar18,1,(uint)bVar30,iVar27,0);
            lappendstr(defs_list,buf);
          }
          else {
            pcVar18 = "#define %s%s (_thread1data + %d)\n#define %s (_thread[_gth]._pval + %d)\n";
            if ((pSVar11->subtype & 0x20) == 0) {
              pcVar18 = "#define %s%s _thread1data[%d]\n#define %s _thread[_gth]._pval[%d]\n";
            }
            sprintf(buf,pcVar18,pSVar11->name,suffix,local_c0,pSVar11->name,local_c0);
            pIVar12 = lappendstr(defs_list,buf);
            pIVar12->itemtype = 0x102;
            if ((pSVar11->subtype & 0x20) == 0) {
              uVar22 = (int)local_c0 + 1;
            }
            else {
              uVar22 = (int)local_c0 + pSVar11->araydim;
            }
            local_c0 = (ulong)uVar22;
          }
        }
        pLVar16 = pLVar16->next;
      } while (pLVar16 != symlist[lVar25]);
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x7b);
  lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
  lappendstr(defs_list,"/* some parameters have upper and lower limits */\n");
  lappendstr(defs_list,"static HocParmLimits _hoc_parm_limits[] = {\n");
  lVar25 = 0x41;
  do {
    pLVar17 = symlist[lVar25];
    for (pLVar16 = pLVar17->next; pLVar16 != pLVar17; pLVar16 = pLVar16->next) {
      pSVar11 = (pLVar16->element).sym;
      if ((pSVar11->subtype & 2) != 0) {
        d1_1 = 0.0;
        d2_1 = 0.0;
        pcVar18 = (pSVar11->u).str;
        if (pcVar18 == (char *)0x0) {
          __assert_fail("sym->u.str",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                        ,0x6e3,"int decode_limits()");
        }
        iVar27 = 0;
LAB_00107747:
        if (*pcVar18 != '\n') {
          if (*pcVar18 == '\0') goto LAB_00107764;
LAB_0010775c:
          pcVar18 = pcVar18 + 1;
          goto LAB_00107747;
        }
        iVar27 = iVar27 + 1;
        if (iVar27 != 3) goto LAB_0010775c;
        pcVar18 = pcVar18 + 1;
LAB_00107764:
        iVar27 = __isoc99_sscanf(pcVar18,"%lf %lf\n",&d1_1,&d2_1);
        if (iVar27 == 2) {
          if (((pSVar11->nrntype & 0x40) == 0) && (point_process != 0)) {
            sprintf(buf,"\"%s\", %g, %g,\n",SUB84(d1_1,0),d2_1,pSVar11->name);
          }
          else {
            sprintf(buf,"\"%s%s\", %g, %g,\n",SUB84(d1_1,0),d2_1,pSVar11->name,suffix);
          }
          lappendstr(defs_list,buf);
        }
        pLVar17 = symlist[lVar25];
      }
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x7b);
  lappendstr(defs_list,"0,0,0\n};\n");
  units_reg();
  lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  lVar25 = 0x41;
  do {
    pLVar17 = symlist[lVar25];
    for (pLVar16 = pLVar17->next; pLVar16 != pLVar17; pLVar16 = pLVar16->next) {
      pSVar11 = (pLVar16->element).sym;
      if ((pSVar11->nrntype & 0x80) != 0) {
        decode_ustr(pSVar11,&d1,&d2,buf);
        bVar30 = (pSVar11->subtype & 0x20) != 0;
        if (bVar30) {
          sprintf(buf,"static double %s[%d];\n",pSVar11->name,(ulong)(uint)pSVar11->araydim);
          pcVar18 = pSVar11->name;
          iVar27 = pSVar11->araydim;
        }
        else {
          sprintf(buf,"static double %s = %g;\n",d1._0_4_,pSVar11->name);
          pcVar18 = pSVar11->name;
          iVar27 = 0;
        }
        add_global_var("double",pcVar18,0,(uint)bVar30,iVar27,0);
        lappendstr(defs_list,buf);
        pLVar17 = symlist[lVar25];
      }
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x7b);
  lappendstr(defs_list,"/* connect global user variables to hoc */\n");
  lappendstr(defs_list,"static DoubScal hoc_scdoub[] = {\n");
  pIVar12 = syminorder->next;
  pIVar14 = syminorder;
  if (pIVar12 != syminorder) {
    do {
      pSVar11 = (pIVar12->element).sym;
      if (((pSVar11->nrntype & 0x40) != 0) && ((pSVar11->subtype & 0x20) == 0)) {
        sprintf(buf,"\"%s%s\", &%s%s,\n",pSVar11->name,suffix,pSVar11->name,suffix);
        lappendstr(defs_list,buf);
        pIVar14 = syminorder;
      }
      pIVar12 = pIVar12->next;
    } while (pIVar12 != pIVar14);
  }
  lappendstr(defs_list,"0,0\n};\n");
  lappendstr(defs_list,"static DoubVec hoc_vdoub[] = {\n");
  pIVar12 = syminorder->next;
  pIVar14 = syminorder;
  if (pIVar12 != syminorder) {
    do {
      pSVar11 = (pIVar12->element).sym;
      if (((pSVar11->nrntype & 0x40) != 0) && ((pSVar11->subtype & 0x20) != 0)) {
        sprintf(buf,"\"%s%s\", %s%s, %d,\n",pSVar11->name,suffix,pSVar11->name,suffix,
                (ulong)(uint)pSVar11->araydim);
        lappendstr(defs_list,buf);
        pIVar14 = syminorder;
      }
      pIVar12 = pIVar12->next;
    } while (pIVar12 != pIVar14);
  }
  lappendstr(defs_list,"0,0,0\n};\n");
  lappendstr(defs_list,"static double _sav_indep;\n");
  if (0 < ba_index_) {
    lappendstr(defs_list,"static void _ba1(NrnThread*, Memb_list*, int)");
    if (1 < ba_index_) {
      uVar22 = 1;
      do {
        uVar22 = uVar22 + 1;
        sprintf(buf,", _ba%d(NrnThread*, Memb_list*, int)",(ulong)uVar22);
        lappendstr(defs_list,buf);
      } while ((int)uVar22 < ba_index_);
    }
    lappendstr(defs_list,";\n");
  }
  lappendstr(defs_list,"static void _create_global_variables(NrnThread*, Memb_list*, int);\n");
  lappendstr(defs_list,"static void _destroy_global_variables(NrnThread*, Memb_list*, int);\n");
  lappendstr(defs_list,
             "static void nrn_alloc(double*, Datum*, int);\nvoid nrn_init(NrnThread*, Memb_list*, int);\nvoid nrn_state(NrnThread*, Memb_list*, int);\n"
            );
  if ((brkpnt_exists != 0) &&
     (lappendstr(defs_list,"void nrn_cur(NrnThread*, Memb_list*, int);\n"), vectorize == 0)) {
    lappendstr(defs_list,"void nrn_jacob(NrnThread*, Memb_list*, int);\n");
  }
  if (watch_seen_ != 0) {
    lappendstr(defs_list,"void _nrn_watch_check(NrnThread*, Memb_list*);\n");
  }
  iVar27 = (uint)diamdec + iVar9 + iVar7 + (uint)areadec;
  if (net_send_seen_ != 0) {
    ppvar_cnt = iVar27;
    tqitem_index = iVar27;
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar12 = lappendstr(ppvar_semantics_,"netsend");
    pIVar12->itemtype = (short)iVar27;
    iVar27 = ppvar_cnt + 1;
  }
  ppvar_cnt = iVar27;
  if (watch_seen_ != 0) {
    watch_index = iVar27;
    if (0 < watch_seen_) {
      iVar27 = 0;
      do {
        iVar10 = ppvar_cnt;
        if (ppvar_semantics_ == (List *)0x0) {
          ppvar_semantics_ = newlist();
        }
        pIVar12 = lappendstr(ppvar_semantics_,"watch");
        pIVar12->itemtype = (short)iVar10 + (short)iVar27;
        iVar27 = iVar27 + 1;
      } while (iVar27 < watch_seen_);
    }
    ppvar_cnt = ppvar_cnt + watch_seen_;
    sprintf(buf,"\n#define _watch_array(arg) _ppvar[(arg + %d)*_STRIDE]",(ulong)(uint)watch_index);
    lappendstr(defs_list,buf);
    lappendstr(defs_list,"\n");
    sprintf(buf,
            "\n#define _nrn_watch_activate(_item)\\\n  if (_watch_rm == 0) {\\\n    int _i;\\\n    for (_i = 1; _i < %d; ++_i) {\\\n      _watch_array(_i) = 0;\\\n    }\\\n    _watch_rm = 1;\\\n  }\\\n  _watch_array(_item) = 2 +"
            ,(ulong)(uint)watch_seen_);
    lappendstr(defs_list,buf);
  }
  if (for_netcons_ != 0) {
    sprintf(buf,"\n#define _fnc_index %d\n",(ulong)(uint)ppvar_cnt);
    lappendstr(defs_list,buf);
    iVar27 = ppvar_cnt;
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar12 = lappendstr(ppvar_semantics_,"fornetcon");
    pIVar12->itemtype = (short)iVar27;
    ppvar_cnt = ppvar_cnt + 1;
  }
  if (point_process != 0) {
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
    lappendstr(defs_list,"static void _hoc_destroy_pnt(_vptr) void* _vptr; {\n");
    if ((for_netcons_ != 0 || watch_seen_ != 0) &&
       (lappendstr(defs_list,"  Prop* _prop = ((Point_process*)_vptr)->_prop;\n"), for_netcons_ != 0
       )) {
      memcpy(buf,"  if (_prop) { _nrn_free_fornetcon(&(_prop->dparam[_fnc_index]._pvoid));}\n",0x4b)
      ;
      lappendstr(defs_list,buf);
    }
    lappendstr(defs_list,"  destroy_point_process(_vptr);\n}\n");
    lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  }
  iVar27 = ppvar_cnt;
  if (cvode_emit != 0) {
    cvode_ieq_index = ppvar_cnt;
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar12 = lappendstr(ppvar_semantics_,"cvodeieq");
    pIVar12->itemtype = (short)iVar27;
    ppvar_cnt = ppvar_cnt + 1;
  }
  cvode_emit_interface();
  if (destructorfunc->next != destructorfunc) {
    if (point_process == 0) {
      diag("DESTRUCTOR only permitted for POINT_PROCESS",(char *)0x0);
    }
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\nstatic void _destructor(Prop*);\n#endif\n");
  }
  if (constructorfunc->next != constructorfunc) {
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\nstatic void _constructor(Prop*);\n#endif\n");
  }
  lappendstr(defs_list,"/* connect range variables in _p that hoc is supposed to know about */\n");
  lappendstr(defs_list,"static const char *_mechanism[] = {\n");
  sprintf(buf,"\"%s\",\n\"%s\",\n",nmodl_version_,mechname);
  lappendstr(defs_list,buf);
  pIVar12 = rangeparm->next;
  if (pIVar12 != rangeparm) {
    do {
      pSVar11 = (pIVar12->element).sym;
      if ((pSVar11->subtype & 0x20) == 0) {
        sprintf(buf,"\"%s%s\",\n",pSVar11->name,rsuffix);
      }
      else {
        sprintf(buf,"\"%s%s[%d]\",\n",pSVar11->name,rsuffix,(ulong)(uint)pSVar11->araydim);
      }
      lappendstr(defs_list,buf);
      pIVar12 = pIVar12->next;
    } while (pIVar12 != rangeparm);
  }
  lappendstr(defs_list,"0,\n");
  pIVar12 = rangedep->next;
  if (pIVar12 != rangedep) {
    do {
      pSVar11 = (pIVar12->element).sym;
      if ((pSVar11->subtype & 0x20) == 0) {
        sprintf(buf,"\"%s%s\",\n",pSVar11->name,rsuffix);
      }
      else {
        sprintf(buf,"\"%s%s[%d]\",\n",pSVar11->name,rsuffix,(ulong)(uint)pSVar11->araydim);
      }
      lappendstr(defs_list,buf);
      pIVar12 = pIVar12->next;
    } while (pIVar12 != rangedep);
  }
  lappendstr(defs_list,"0,\n");
  pIVar12 = rangestate->next;
  if (pIVar12 != rangestate) {
    do {
      pSVar11 = (pIVar12->element).sym;
      if ((pSVar11->subtype & 0x20) == 0) {
        sprintf(buf,"\"%s%s\",\n",pSVar11->name,rsuffix);
      }
      else {
        sprintf(buf,"\"%s%s[%d]\",\n",pSVar11->name,rsuffix,(ulong)(uint)pSVar11->araydim);
      }
      lappendstr(defs_list,buf);
      pIVar12 = pIVar12->next;
    } while (pIVar12 != rangestate);
  }
  lappendstr(defs_list,"0,\n");
  pIVar12 = nrnpointers->next;
  if (pIVar12 != nrnpointers) {
    do {
      pSVar11 = (pIVar12->element).sym;
      if ((pSVar11->subtype & 0x20) == 0) {
        sprintf(buf,"\"%s%s\",\n",pSVar11->name,rsuffix);
      }
      else {
        sprintf(buf,"\"%s%s[%d]\",\n",pSVar11->name,rsuffix,(ulong)(uint)pSVar11->araydim);
      }
      lappendstr(defs_list,buf);
      pIVar12 = pIVar12->next;
    } while (pIVar12 != nrnpointers);
  }
  lappendstr(defs_list,"0};\n");
  if (diamdec == 1) {
    lappendstr(defs_list,"static Symbol* _morphology_sym;\n");
  }
  pIVar12 = useion->next;
  if (pIVar12 != useion) {
    do {
      pSVar11 = (pIVar12->element).sym;
      sprintf(buf,"static int _%s_type;\n",pSVar11->name);
      lappendstr(defs_list,buf);
      if (ldifuslist != (List *)0x0) {
        sprintf(buf,"static int _type_i%s;\n",pSVar11->name);
        lappendstr(defs_list,buf);
      }
      pIVar12 = pIVar12->next->next->next->next;
    } while (pIVar12 != useion);
  }
  lappendstr(globals_update_list,"struct _global_variables_t : public MemoryManaged {\n");
  if (0 < global_variables_count) {
    lVar26 = 0;
    lVar25 = 0;
    do {
      if (*(int *)((long)&global_variables->is_array + lVar26) == 0) {
        sprintf(buf,"  %s %s;\n",global_variables->type + lVar26);
      }
      else {
        sprintf(buf,"  %s %s[%d];\n",global_variables->type + lVar26,global_variables->name + lVar26
                ,(ulong)*(uint *)((long)&global_variables->array_length + lVar26));
      }
      lappendstr(globals_update_list,buf);
      lVar25 = lVar25 + 1;
      lVar26 = lVar26 + 0x2020;
    } while (lVar25 < global_variables_count);
  }
  lappendstr(globals_update_list,"};\n\n");
  lappendstr(globals_update_list,
             "\nstatic void _create_global_variables(NrnThread *_nt, Memb_list *_ml, int _type) {\n"
            );
  lappendstr(globals_update_list,"  assert(!_ml->global_variables);\n");
  lappendstr(globals_update_list,"  _ml->global_variables = new _global_variables_t{};\n");
  lappendstr(globals_update_list,"  _ml->global_variables_size = sizeof(_global_variables_t);\n");
  lappendstr(globals_update_list,"}\n");
  lappendstr(globals_update_list,
             "\nstatic void _destroy_global_variables(NrnThread *_nt, Memb_list *_ml, int _type) {\n"
            );
  lappendstr(globals_update_list,
             "  delete static_cast<_global_variables_t*>(_ml->global_variables);\n");
  lappendstr(globals_update_list,"  _ml->global_variables = nullptr;\n");
  lappendstr(globals_update_list,"  _ml->global_variables_size = 0;\n");
  lappendstr(globals_update_list,"}\n");
  lappendstr(globals_update_list,
             "\nstatic void _update_global_variables(NrnThread *_nt, Memb_list *_ml) {\n");
  lappendstr(globals_update_list,"  if(!_nt || !_ml) {\n");
  lappendstr(globals_update_list,"    return;\n");
  lappendstr(globals_update_list,"  }\n");
  lappendstr(globals_update_list,
             "  auto* const _global_variables = static_cast<_global_variables_t*>(_ml->global_variables);\n"
            );
  if (0 < global_variables_count) {
    lVar25 = 0;
    pgVar15 = global_variables;
    pgVar20 = global_variables;
    do {
      if (pgVar20[lVar25].skip_initialisation == 0) {
        pcVar18 = suffix;
        if (pgVar20[lVar25].is_nrnglobal == 0) {
          pcVar18 = "";
        }
        if (pgVar20[lVar25].is_array == 0) {
          sprintf(buf,"  _global_variables->%s = %s%s;\n",pgVar20[lVar25].name,pgVar20[lVar25].name,
                  pcVar18);
          lappendstr(globals_update_list,buf);
          pgVar15 = global_variables;
          pgVar20 = global_variables;
        }
        else {
          pgVar20 = pgVar15;
          if (0 < pgVar15[lVar25].array_length) {
            uVar23 = 0;
            do {
              sprintf(buf,"  _global_variables->%s[%d] = %s%s[%d];\n",pgVar15[lVar25].name,uVar23,
                      pgVar15[lVar25].name,pcVar18,uVar23);
              lappendstr(globals_update_list,buf);
              uVar22 = (int)uVar23 + 1;
              uVar23 = (ulong)uVar22;
              pgVar15 = global_variables;
              pgVar20 = global_variables;
            } while ((int)uVar22 < global_variables[lVar25].array_length);
          }
        }
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < global_variables_count);
  }
  if (artificial_cell == 0) {
    lappendstr(globals_update_list,"#ifdef CORENEURON_ENABLE_GPU\n");
    lappendstr(globals_update_list,"  if (_nt->compute_gpu) {\n");
    lappendstr(globals_update_list,"      cnrn_target_update_on_device(_global_variables);\n");
    lappendstr(globals_update_list,"  }\n");
    lappendstr(globals_update_list,"#endif\n");
  }
  lappendstr(globals_update_list,"}\n\n");
  if (0 < global_variables_count) {
    lVar26 = 0x10;
    lVar25 = 0;
    do {
      sprintf(buf,"#define %s static_cast<_global_variables_t*>(_ml->global_variables)->%s\n",
              global_variables->type + lVar26);
      lappendstr(globals_update_list,buf);
      lVar25 = lVar25 + 1;
      lVar26 = lVar26 + 0x2020;
    } while (lVar25 < global_variables_count);
  }
  lappendstr(globals_update_list,"\n");
  lappendstr(defs_list,"\nstatic void nrn_alloc(double* _p, Datum* _ppvar, int _type) {\n");
  lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
  lappendstr(defs_list,"\t/*initialize range parameters*/\n");
  pLVar16 = rangeparm->next;
  if (pLVar16 != rangeparm) {
    pIVar12 = rangeparm;
    do {
      pSVar11 = (pLVar16->element).sym;
      if ((pSVar11->subtype & 0x20) == 0) {
        decode_ustr(pSVar11,&d1,&d2,buf);
        sprintf(buf,"\t%s = %g;\n",d1._0_4_,pSVar11->name);
        lappendstr(defs_list,buf);
        pIVar12 = rangeparm;
      }
      pLVar16 = pLVar16->next;
    } while (pLVar16 != pIVar12);
  }
  sVar21 = (short)(iVar9 + iVar7);
  if (diamdec == 1) {
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar12 = lappendstr(ppvar_semantics_,"diam");
    pIVar12->itemtype = sVar21;
  }
  if (areadec == 1) {
    uVar5 = (ushort)diamdec;
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar12 = lappendstr(ppvar_semantics_,"area");
    pIVar12->itemtype = sVar21 + uVar5;
  }
  pLVar16 = useion->next;
  if (pLVar16 != useion) {
    uVar23 = (ulong)((uint)(point_process != 0) * 2);
    do {
      pSVar11 = (pLVar16->element).sym;
      sprintf(buf,"prop_ion = need_memb(_%s_sym);\n",pSVar11->name);
      lappendstr(defs_list,buf);
      if (ldifuslist != (List *)0x0) {
        sprintf(buf," _type_i%s = prop_ion->_type;\n",pSVar11->name);
        lappendstr(defs_list,buf);
      }
      pIVar14 = pLVar16->next;
      pcVar18 = ((pLVar16->element).sym)->name;
      pIVar12 = ((pIVar14->element).itm)->next;
      if (pIVar12 == (pIVar14->element).itm) {
        uVar8 = 0;
        uVar22 = 0;
      }
      else {
        uVar22 = 0;
        uVar8 = 0;
        do {
          iVar7 = iontype(((pIVar12->element).sym)->name,pcVar18);
          if (iVar7 == 0) {
            uVar22 = 1;
          }
          if (iVar7 - 1U < 2) {
            uVar8 = 1;
          }
          pIVar12 = pIVar12->next;
          pIVar14 = pLVar16->next;
        } while (pIVar12 != (pIVar14->element).itm);
      }
      pIVar12 = (pIVar14->next->element).itm;
      pIVar13 = pIVar12->next;
      if (pIVar13 != pIVar12) {
        do {
          iVar7 = iontype(((pIVar13->element).sym)->name,pcVar18);
          pcVar24 = "nrn_check_conc_write(_prop, prop_ion, 1);\n";
          if (iVar7 == 1) {
LAB_0010887c:
            lappendstr(defs_list,pcVar24);
            uVar8 = 3;
          }
          else if (iVar7 == 2) {
            pcVar24 = "nrn_check_conc_write(_prop, prop_ion, 0);\n";
            goto LAB_0010887c;
          }
          if (iVar7 == 0) {
            uVar22 = 3;
          }
          pIVar13 = pIVar13->next;
          pIVar14 = pLVar16->next;
        } while (pIVar13 != (pIVar14->next->element).itm);
      }
      if (uVar8 != 0 || uVar22 != 0) {
        sprintf(buf,"nrn_promote(prop_ion, %d, %d);\n",(ulong)uVar8,(ulong)uVar22);
        lappendstr(defs_list,buf);
        pIVar14 = pLVar16->next;
      }
      pIVar12 = ((pIVar14->element).itm)->next;
      uVar28 = uVar23;
      if (pIVar12 != (pIVar14->element).itm) {
        do {
          psVar1 = &((pIVar12->element).sym)->nrntype;
          *psVar1 = *psVar1 | 0x200;
          uVar8 = (int)uVar28 + 1;
          uVar23 = (ulong)uVar8;
          uVar22 = iontype(((pIVar12->element).sym)->name,pSVar11->name);
          sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* %s */\n",uVar28,(ulong)uVar22,
                  ((pIVar12->element).sym)->name);
          lappendstr(defs_list,buf);
          pIVar12 = pIVar12->next;
          uVar28 = (ulong)uVar8;
        } while (pIVar12 != (pIVar14->element).itm);
      }
      pIVar12 = pIVar14->next;
      pIVar14 = ((pIVar12->element).itm)->next;
      if (pIVar14 == (pIVar12->element).itm) {
        bVar30 = true;
      }
      else {
        bVar6 = false;
        bVar30 = false;
        do {
          uVar22 = iontype(((pIVar14->element).sym)->name,pSVar11->name);
          pSVar4 = (pIVar14->element).sym;
          uVar3._0_2_ = pSVar4->nrntype;
          uVar3._2_2_ = pSVar4->assigned_to_;
          if ((uVar3 >> 9 & 1) == 0) {
            sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* %s */\n",uVar23,(ulong)uVar22
                    ,pSVar4->name);
            lappendstr(defs_list,buf);
            uVar23 = (ulong)((int)uVar23 + 1);
          }
          else {
            pSVar4->nrntype = (undefined2)uVar3 & 0xfdff;
          }
          if (uVar22 == 3) {
            sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* _ion_di%sdv */\n",uVar23,4,
                    pSVar11->name);
            lappendstr(defs_list,buf);
            bVar30 = true;
            uVar23 = (ulong)((int)uVar23 + 1);
          }
          if (uVar22 - 1 < 2) {
            bVar6 = true;
          }
          pIVar14 = pIVar14->next;
        } while (pIVar14 != (pIVar12->element).itm);
        bVar30 = !bVar30;
        if (bVar6) {
          sprintf(buf,
                  "\t_ppvar[%d]._pvoid = (void*)(&(prop_ion->dparam[0]._i)); /* iontype for %s */\n"
                  ,uVar23,pSVar11->name);
          lappendstr(defs_list,buf);
          uVar23 = (ulong)((int)uVar23 + 1);
        }
      }
      pIVar12 = pIVar12->next;
      if ((bVar30) && (ldifuslist != (List *)0x0)) {
        sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* _ion_di%sdv */\n",uVar23,4,
                pSVar11->name);
        lappendstr(defs_list,buf);
        uVar23 = (ulong)((int)uVar23 + 1);
      }
      pLVar16 = pIVar12->next;
    } while (pLVar16 != useion);
  }
  lappendstr(defs_list,"\n#endif /* BBCORE */\n");
  if (constructorfunc->next != constructorfunc) {
    lappendstr(defs_list,
               "\n#if 0 /*BBCORE*/\nif (!nrn_point_prop_) {_constructor(_prop);}\n#endif\n");
    pcVar18 = 
    "\n#if 0 /*BBCORE*/\nstatic _constructor(_prop)\n\tProp *_prop; double* _p; Datum* _ppvar; ThreadDatum* _thread;\n{\n\t_thread = (Datum*)0;\n\t_p = _prop->param; _ppvar = _prop->dparam;\n{\n"
    ;
    if (vectorize == 0) {
      pcVar18 = 
      "\n#if 0 /*BBCORE*/\nstatic void _constructor(Prop* _prop) {\n\t_p = _prop->param; _ppvar = _prop->dparam;\n{\n"
      ;
    }
    lappendstr(procfunc,pcVar18);
    movelist(constructorfunc->next,constructorfunc->prev,procfunc);
    lappendstr(procfunc,"\n}\n}\n#endif /*BBCORE*/\n");
  }
  lappendstr(defs_list,"\n}\n");
  lappendstr(defs_list,"static void _initlists(Memb_list *_ml);\n");
  if (cvode_emit != 0) {
    lappendstr(defs_list," /* some states have an absolute tolerance */\n");
    lappendstr(defs_list,"static Symbol** _atollist;\n");
    lappendstr(defs_list,"static HocStateTolerance _hoc_state_tol[] = {\n");
    pLVar16 = rangestate->next;
    if (pLVar16 != rangestate) {
      do {
        pSVar11 = (pLVar16->element).sym;
        if ((pSVar11->subtype & 0x10) != 0) {
          pcVar18 = (pSVar11->u).str;
          iVar7 = 0;
LAB_00108c89:
          if (*pcVar18 != '\n') {
            if (*pcVar18 == '\0') goto LAB_00108ca6;
LAB_00108c9e:
            pcVar18 = pcVar18 + 1;
            goto LAB_00108c89;
          }
          iVar7 = iVar7 + 1;
          if (iVar7 != 3) goto LAB_00108c9e;
          pcVar18 = pcVar18 + 1;
LAB_00108ca6:
          iVar7 = __isoc99_sscanf(pcVar18,"%lf\n",&d1_1);
          if (iVar7 == 1) {
            if (point_process == 0) {
              sprintf(buf,"\"%s%s\", %g,\n",SUB84(d1_1,0),pSVar11->name,suffix);
            }
            else {
              sprintf(buf,"\"%s\", %g,\n",SUB84(d1_1,0),pSVar11->name);
            }
            lappendstr(defs_list,buf);
          }
        }
        pLVar16 = pLVar16->next;
      } while (pLVar16 != rangestate);
    }
    lappendstr(defs_list,"0,0\n};\n");
  }
  if (singlechan_ != 0) {
    sprintf(buf,"static _singlechan_declare%d();\n");
    lappendstr(defs_list,buf);
  }
  if (net_send_seen_ != 0) {
    if (net_receive_ == 0) {
      diag("can\'t use net_send if there is no NET_RECEIVE block",(char *)0x0);
    }
    sprintf(buf,"\n#define _tqitem &(_nt->_vdata[_ppvar[%d*_STRIDE]])\n",(ulong)(uint)tqitem_index);
    lappendstr(defs_list,buf);
    if (net_receive_buffering_ != 0) {
      sprintf(buf,
              "\n#if NET_RECEIVE_BUFFERING\n#undef _tqitem\n#define _tqitem _ppvar[%d*_STRIDE]\n#endif\n\n"
              ,(ulong)(uint)tqitem_index);
      lappendstr(defs_list,buf);
    }
    if (net_send_delivered_ != (Item *)0x0) {
      insertstr(net_send_delivered_,
                "\n#if !NET_RECEIVE_BUFFERING\n  if (_lflag == 1. ) {*(_tqitem) = 0;}\n#endif\n");
    }
  }
  if ((net_receive_ != 0) &&
     (lappendstr(defs_list,"void _net_receive(Point_process*, int, double);\n"),
     net_init_q1_ != (Item *)0x0)) {
    lappendstr(defs_list,"void _net_init(Point_process*, int, double);\n");
  }
  if ((vectorize != 0) &&
     (((thread_mem_init_list->next == thread_mem_init_list ||
       (lappendstr(defs_list,"static void _thread_mem_init(ThreadDatum*);\n"), vectorize != 0)) &&
      (thread_cleanup_list->next != thread_cleanup_list)))) {
    lappendstr(defs_list,"static void _thread_cleanup(ThreadDatum*);\n");
  }
  if (uip != (List *)0x0) {
    lappendstr(defs_list,"static void _update_ion_pointer(Datum*);\n");
  }
  sprintf(buf,"\n#define _psize %d\n#define _ppsize %d\n",(ulong)(uint)parraycount,
          (ulong)(uint)ppvar_cnt);
  lappendstr(defs_list,buf);
  sprintf(buf,"void _%s_reg() {\n\tint _vectorized = %d;\n",modbase,(ulong)(uint)vectorize);
  lappendstr(defs_list,buf);
  lappendstr(defs_list,"");
  if (suffix[0] != '\0') {
    lappendstr(defs_list,"_mechtype = nrn_get_mechtype(_mechanism[1]);\n");
    lappendstr(defs_list,"if (_mechtype == -1) return;\n");
    lappendstr(defs_list,"_nrn_layout_reg(_mechtype, LAYOUT);\n");
    pIVar12 = useion->next;
    if (pIVar12 != useion) {
      do {
        sprintf(buf,"_%s_type = nrn_get_mechtype(\"%s_ion\");",((pIVar12->element).sym)->name);
        lappendstr(defs_list,buf);
        pIVar12 = pIVar12->next->next->next->next;
      } while (pIVar12 != useion);
    }
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
    pIVar12 = useion->next;
    if (pIVar12 != useion) {
      do {
        sprintf(buf,"\tion_reg(\"%s\", %s);\n",((pIVar12->element).sym)->name,
                (pIVar12->next->next->next->element).itm);
        lappendstr(defs_list,buf);
        pIVar12 = pIVar12->next->next->next->next;
      } while (pIVar12 != useion);
    }
    if (diamdec == 1) {
      lappendstr(defs_list,"\t_morphology_sym = hoc_lookup(\"morphology\");\n");
    }
    pIVar12 = useion->next;
    if (pIVar12 != useion) {
      do {
        sprintf(buf,"\t_%s_sym = hoc_lookup(\"%s_ion\");\n",((pIVar12->element).sym)->name);
        lappendstr(defs_list,buf);
        pIVar12 = pIVar12->next->next->next->next;
      } while (pIVar12 != useion);
    }
    lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
    uVar22 = thread_data_index + 1;
    if (vectorize == 0) {
      uVar22 = 0;
    }
    if (point_process == 0) {
      sprintf(buf,
              " register_mech(_mechanism, nrn_alloc,%s, nrn_init, _create_global_variables, _destroy_global_variables, hoc_nrnpointerindex, %d);\n"
              ,brkpnt_str_,(ulong)uVar22);
      pcVar18 = buf;
LAB_00109182:
      pIVar12 = local_a8;
      lappendstr(defs_list,pcVar18);
    }
    else {
      sprintf(buf,
              "\t_pointtype = point_register_mech(_mechanism,\n\t nrn_alloc,%s, nrn_init, _create_global_variables, _destroy_global_variables,\n\t hoc_nrnpointerindex,\n\t NULL/*_hoc_create_pnt*/, NULL/*_hoc_destroy_pnt*/, /*_member_func,*/\n\t %d);\n"
              ,brkpnt_str_,(ulong)uVar22);
      lappendstr(defs_list,buf);
      pIVar12 = local_a8;
      if (destructorfunc->next != destructorfunc) {
        pcVar18 = "    #if 0 /*BBCORE*/\n    register_destructor(_destructor);\n    #endif\n";
        goto LAB_00109182;
      }
    }
    if (thread_data_index != 0 && vectorize != 0) {
      sprintf(buf," _extcall_thread = (ThreadDatum*)ecalloc(%d, sizeof(ThreadDatum));\n");
      lappendstr(defs_list,buf);
      if ((thread_mem_init_list->next != thread_mem_init_list) &&
         (lappendstr(defs_list," _thread_mem_init(_extcall_thread);\n"), (int)local_c0 != 0)) {
        lappendstr(defs_list," _thread1data_inuse = 0;\n");
      }
    }
    if (vectorize != 0) {
      insertstr(pIVar12,"\n#define _thread_present_ /**/");
      if (thread_data_index != 0) {
        sprintf(buf,", _thread[0:%d]");
        insertstr(pIVar12,buf);
      }
      insertstr(pIVar12,"\n");
      if (((vectorize != 0) &&
          ((thread_mem_init_list->next == thread_mem_init_list ||
           (lappendstr(defs_list,"    _nrn_thread_reg1(_mechtype, _thread_mem_init);\n"),
           vectorize != 0)))) && (thread_cleanup_list->next != thread_cleanup_list)) {
        lappendstr(defs_list,"    _nrn_thread_reg0(_mechtype, _thread_cleanup);\n");
      }
    }
    if (!bVar29) {
      lappendstr(defs_list,"    _nrn_thread_table_reg(_mechtype, _check_table_thread);\n");
    }
    if (use_bbcorepointer == '\x01') {
      lappendstr(defs_list,"  hoc_reg_bbcore_read(_mechtype, bbcore_read);\n");
      lappendstr(defs_list,"  hoc_reg_bbcore_write(_mechtype, bbcore_write);\n");
    }
    builtin_strncpy(buf," hoc_register_prop_size(_mechtype, _psize, _ppsize);\n",0x36);
    lappendstr(defs_list,buf);
    if ((ppvar_semantics_ != (List *)0x0) &&
       (pIVar12 = ppvar_semantics_->next, pIVar12 != ppvar_semantics_)) {
      do {
        sprintf(buf," hoc_register_dparam_semantics(_mechtype, %d, \"%s\");\n",
                (ulong)(uint)(int)pIVar12->itemtype,(pIVar12->element).itm);
        lappendstr(defs_list,buf);
        pIVar12 = pIVar12->next;
      } while (pIVar12 != ppvar_semantics_);
    }
    pLVar16 = useion->next;
    if (pLVar16 != useion) {
      iVar7 = 0;
      pIVar12 = useion;
      do {
        pIVar14 = pLVar16->next->next;
        pIVar13 = ((pIVar14->element).itm)->next;
        if (pIVar13 != (pIVar14->element).itm) {
          do {
            iVar9 = iontype(((pIVar13->element).sym)->name,((pLVar16->element).sym)->name);
            iVar7 = iVar7 + (uint)(iVar9 - 1U < 2);
            pIVar13 = pIVar13->next;
            pIVar14 = pLVar16->next->next;
            pIVar12 = useion;
          } while (pIVar13 != (pIVar14->element).itm);
        }
        pLVar16 = pIVar14->next->next;
      } while (pLVar16 != pIVar12);
      if (iVar7 != 0) {
        lappendstr(defs_list,"\tnrn_writes_conc(_mechtype, 0);\n");
      }
    }
    printf("cvode_emit=%d cvode_not_allowed=%d\n",(ulong)(uint)cvode_emit,
           (ulong)(uint)cvode_not_allowed);
    if (cvode_emit != 0) {
      lappendstr(defs_list,
                 "\thoc_register_cvode(_mechtype, _ode_count, _ode_map, _ode_spec, _ode_matsol);\n")
      ;
      lappendstr(defs_list,"\thoc_register_tolerance(_mechtype, _hoc_state_tol, &_atollist);\n");
      if (ion_synonym != (List *)0x0) {
        lappendstr(defs_list,"\thoc_register_synonym(_mechtype, _ode_synonym);\n");
      }
    }
    if (singlechan_ != 0) {
      sprintf(buf,"hoc_reg_singlechan(_mechtype, _singlechan_declare%d);\n");
      lappendstr(defs_list,buf);
    }
    if (artificial_cell != 0) {
      if ((((brkpnt_exists != 0) || (net_receive_ == 0)) || (nrnpointers->next != nrnpointers)) ||
         (useion->next != useion)) {
        puts(
            "Notice: ARTIFICIAL_CELL is a synonym for POINT_PROCESS which hints that it\nonly affects and is affected by discrete events. As such it is not\nlocated in a section and is not associated with an integrator"
            );
      }
      sprintf(buf,"add_nrn_artcell(_mechtype, %d);\n",(ulong)(uint)tqitem_index);
      lappendstr(defs_list,buf);
    }
    if (net_event_seen_ != 0) {
      lappendstr(defs_list,"add_nrn_has_net_event(_mechtype);\n");
    }
    if (watch_seen_ != 0) {
      lappendstr(defs_list,"hoc_register_watch_check(_nrn_watch_check, _mechtype);\n");
    }
    if ((net_receive_buffering_ != 0) &&
       (lappendstr(defs_list,
                   "\n#if NET_RECEIVE_BUFFERING\n  hoc_register_net_receive_buffering(_net_buf_receive, _mechtype);\n#endif\n"
                  ), net_event_seen_ != 0 || net_send_seen_ != 0)) {
      lappendstr(defs_list,
                 "\n#if NET_RECEIVE_BUFFERING\n  hoc_register_net_send_buffering(_mechtype);\n#endif\n"
                );
    }
    if (net_receive_ != 0) {
      pcVar18 = "set_pnt_receive(_mechtype, _net_receive, _net_init, %d);\n";
      if (net_init_q1_ == (Item *)0x0) {
        pcVar18 = "set_pnt_receive(_mechtype, _net_receive, nullptr, %d);\n";
      }
      sprintf(buf,pcVar18);
      lappendstr(defs_list,buf);
    }
    if (for_netcons_ != 0) {
      builtin_strncpy(buf + 0x20,"nc_index);\n",0xc);
      builtin_strncpy(buf + 0x10,"ns(_mechtype, _f",0x10);
      builtin_strncpy(buf,"add_nrn_fornetco",0x10);
      lappendstr(defs_list,buf);
    }
    if (0 < ba_index_) {
      uVar22 = 0;
      pIVar12 = ba_list_;
      do {
        pIVar12 = pIVar12->next;
        pLVar16 = get_ion_variables(0);
        if (pLVar16->next != pLVar16->prev) {
          move(pLVar16->next,pLVar16->prev,(pIVar12->element).itm);
          freelist((List **)pLVar16);
        }
        pIVar12 = pIVar12->next;
        pLVar16 = set_ion_variables(0);
        if (pLVar16->next != pLVar16->prev) {
          move(pLVar16->next,pLVar16->prev,(pIVar12->element).itm);
          freelist((List **)pLVar16);
        }
        uVar22 = uVar22 + 1;
        pIVar12 = pIVar12->next;
        sprintf(buf,"\thoc_reg_ba(_mechtype, _ba%d, %s);\n",(ulong)uVar22,(pIVar12->element).itm);
        lappendstr(defs_list,buf);
      } while ((int)uVar22 < ba_index_);
    }
    if (ldifuslist != (List *)0x0) {
      lappendstr(defs_list,"\thoc_register_ldifus1(_difusfunc);\n");
      linsertstr(defs_list,"static void _difusfunc(ldifusfunc2_t, NrnThread*);\n");
    }
  }
  lappendstr(defs_list,"\thoc_register_var(hoc_scdoub, hoc_vdoub, NULL);\n");
  lappendstr(defs_list,"}\n");
  if (vectorize != 0) {
    if (thread_mem_init_list->next != thread_mem_init_list) {
      lappendstr(procfunc,"\nstatic void _thread_mem_init(ThreadDatum* _thread) {\n");
      move(thread_mem_init_list->next,thread_mem_init_list->prev,procfunc);
      lappendstr(procfunc,"}\n");
      if (vectorize == 0) goto LAB_00109818;
    }
    if (thread_cleanup_list->next != thread_cleanup_list) {
      lappendstr(procfunc,"\nstatic void _thread_cleanup(ThreadDatum* _thread) {\n");
      move(thread_cleanup_list->next,thread_cleanup_list->prev,procfunc);
      lappendstr(procfunc,"}\n");
    }
  }
LAB_00109818:
  if (uip != (List *)0x0) {
    move(uip->next,uip->prev,procfunc);
  }
  if (destructorfunc->next != destructorfunc) {
    pcVar18 = 
    "\n#if 0 /*BBCORE*/\nstatic _destructor(_prop)\n\tProp *_prop; double* _p; Datum* _ppvar; ThreadDatum* _thread;\n{\n\t_thread = (Datum*)0;\n\t_p = prop->param; _ppvar = _prop->dparam;\n{\n"
    ;
    if (vectorize == 0) {
      pcVar18 = 
      "\n#if 0 /*BBCORE*/\nstatic void _destructor(Prop* _prop) {\n\t_p = _prop->param; _ppvar = _prop->dparam;\n{\n"
      ;
    }
    lappendstr(procfunc,pcVar18);
    movelist(destructorfunc->next,destructorfunc->prev,procfunc);
    lappendstr(procfunc,"\n}\n}\n#endif /*BBCORE*/\n");
  }
  if (ldifuslist != (List *)0x0) {
    ldifusreg();
  }
  if (watch_seen_ != 0) {
    lappendstr(procfunc,
               "\nvoid _nrn_watch_check(NrnThread* _nt, Memb_list* _ml) {\n  double* _p; Datum* _ppvar; ThreadDatum* _thread;\n  int* _ni; double v; int _iml, _cntml_padded, _cntml_actual;\n  _cntml_actual = _ml->_nodecount;\n  _cntml_padded = _ml->_nodecount_padded;\n  _ni = _ml->_nodeindices;\n  _thread = _ml->_thread;\n  double * _nt_data = _nt->_data;\n  double * _vec_v = _nt->_actual_v;\n  int stream_id = _nt->stream_id;\n"
              );
    lappendstr(procfunc,
               "\n  #if LAYOUT == 1 /*AoS*/\n  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n    _p = _ml->_data + _iml*_psize; _ppvar = _ml->_pdata + _iml*_ppsize;\n  #elif LAYOUT == 0 /*SoA*/\n    _p = _ml->_data; _ppvar = _ml->_pdata;\n  /* insert compiler dependent ivdep like pragma */\n  _PRAGMA_FOR_VECTOR_LOOP_\n  _PRAGMA_FOR_STATE_ACC_LOOP_\n  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n  #else /* LAYOUT > 1 */ /*AoSoA*/\n  #error AoSoA not implemented.\n  for (;;) { /* help clang-format properly indent */\n  #endif\n    v = _vec_v[_ni[_iml]];\n#if NRN_PRCELLSTATE\n    _v_unused = v;\n#endif\n    bool _untriggered = true;\n"
              );
    pLVar16 = watch_data_->next;
    if (pLVar16 != watch_data_) {
      uVar23 = 1;
      do {
        pIVar12 = pLVar16->next->next;
        pSVar11 = (pIVar12->element).sym;
        pcVar18 = items_as_string((pLVar16->element).itm,(pLVar16->next->element).itm);
        lVar25 = pSVar11->subtype;
        sprintf(buf,
                "\n    if (_watch_array(%d)&2 && _untriggered) {\n      if %s {\n        if ((_watch_array(%d)&1) == 0) {\n          _untriggered = false;\n          #if NET_RECEIVE_BUFFERING\n          _net_send_buffering(_ml->_net_send_buffer, 0, _tqitem, -1, _ppvar[1*_STRIDE], t +  0.0 , %s );\n          #else\n          net_send ( _tqitem, -1, (Point_process*) _nt->_vdata[_ppvar[1*_STRIDE]], t +  0.0 , %s ) ;\n          #endif\n        }\n        _watch_array(%d) = 3;\n      }else{\n        _watch_array(%d) = 2;\n      }\n    }\n"
                ,uVar23,pcVar18,uVar23,lVar25,lVar25,uVar23,uVar23);
        lappendstr(procfunc,buf);
        free(pcVar18);
        pLVar16 = pIVar12->next;
        uVar23 = (ulong)((int)uVar23 + 1);
      } while (pLVar16 != watch_data_);
    }
    buf._4_4_ = SUB84(buf._0_8_,4) & 0xffffff00;
    builtin_strncpy(buf,"  }\n",4);
    lappendstr(procfunc,buf);
    lappendstr(procfunc,
               "\n#if NET_RECEIVE_BUFFERING\n  NetSendBuffer_t* _nsb = _ml->_net_send_buffer;\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n  #pragma acc wait(stream_id)\n  #pragma acc update self(_nsb->_cnt) if(_nt->compute_gpu)\n  update_net_send_buffer_on_host(_nt, _nsb);\n#endif\n  {int _i;\n  for (_i=0; _i < _nsb->_cnt; ++_i) {\n    net_sem_from_gpu(_nsb->_sendtype[_i], _nsb->_vdata_index[_i],\n      _nsb->_weight_index[_i], _nt->_id, _nsb->_pnt_index[_i],\n      _nsb->_nsb_t[_i], _nsb->_nsb_flag[_i]);\n  }}\n  _nsb->_cnt = 0;\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n  #pragma acc update device(_nsb->_cnt) if(_nt->compute_gpu)\n#endif\n#endif\n"
              );
    lappendstr(procfunc,"}\n");
  }
  lVar25 = 0x41;
  do {
    pLVar17 = symlist[lVar25];
    for (pLVar16 = pLVar17->next; pLVar16 != pLVar17; pLVar16 = pLVar16->next) {
      if ((((pLVar16->element).sym)->subtype & 2) != 0) {
        warn_ignore((pLVar16->element).sym);
        pLVar17 = symlist[lVar25];
      }
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x7b);
  return;
}

Assistant:

void parout() {
	int i, j, ioncount, pointercount, gind, emit_check_table_thread;
	Item *q, *q1, *extra_pragma_loop_arg;
	Symbol *s, *sion;
	double d1, d2;

#if BBCORE
	cvode_emit = 0;
#endif

	defs_list = newlist();	/* relates hoc names to c-variables */
	if (brkpnt_exists) {
	    if (vectorize) {
		brkpnt_str_ = "nrn_cur, NULL, nrn_state";
	    }else{
		brkpnt_str_ = "nrn_cur, nrn_jacob, nrn_state";
	    }
	}else{
		brkpnt_str_ = "0, 0, 0";
#if 1 || defined(__MINGW32__)
		/* x86_64-w64-mingw32-gcc passed 0 without zeroing the high 32 bits */
		/* also cygwin64 gcc 4.8.1, so cast to void* universally */
		brkpnt_str_ = "NULL, NULL, NULL";
#endif
	}

	set_suffix();	

	if (artificial_cell && vectorize && (thread_data_index || toplocal_)) {
fprintf(stderr, "Notice: ARTIFICIAL_CELL models that would require thread specific data are not thread safe.\n");	
		vectorize = 0;
	}
	if (point_process) {
		rsuffix = "";
	}else{
		rsuffix = suffix;
	}

	if (point_process && !artificial_cell && net_receive_) {
	  	net_receive_buffering_ = 1;
		emit_net_receive_buffering_code();
	}

	Lappendstr(defs_list, "\
\n#include \"coreneuron/utils/randoms/nrnran123.h\"\
\n#include \"coreneuron/nrnoc/md1redef.h\"\
\n#include \"coreneuron/nrnconf.h\"\
\n#include \"coreneuron/sim/multicore.hpp\"\
\n#include \"coreneuron/nrniv/nrniv_decl.h\"\
\n#include \"coreneuron/utils/ivocvect.hpp\"\
\n#include \"coreneuron/utils/nrnoc_aux.hpp\"\
\n#include \"coreneuron/gpu/nrn_acc_manager.hpp\"\
\n#include \"coreneuron/sim/scopmath/newton_struct.h\"\
\n#include \"coreneuron/sim/scopmath/newton_thread.hpp\"\
\n#include \"coreneuron/sim/scopmath/sparse_thread.hpp\"\
\n#include \"coreneuron/sim/scopmath/ssimplic_thread.hpp\"\
\n#include \"coreneuron/nrnoc/md2redef.h\"\
\n#include \"coreneuron/mechanism/register_mech.hpp\"\
\n#if !NRNGPU\
\n#if !defined(DISABLE_HOC_EXP)\
\n#undef exp\
\n#define exp hoc_Exp\
\n#endif\
\n#endif\n\
");
	if (use_bbcorepointer) {
        Lappendstr(defs_list, "#define _threadargsproto_namespace int _iml, int _cntml_padded, double* _p, coreneuron::Datum* _ppvar, coreneuron::ThreadDatum* _thread, coreneuron::NrnThread* _nt, coreneuron::Memb_list* _ml, double v\n");

		lappendstr(defs_list, "static void bbcore_read(double *, int*, int*, int*, _threadargsproto_namespace);\n");
		lappendstr(defs_list, "static void bbcore_write(double *, int*, int*, int*, _threadargsproto_namespace);\n");
	}

	Lappendstr(defs_list, "namespace coreneuron {\n");
	if (vectorize) {
        /* macros for compiler dependent ivdep like pragma and memory layout. INIT and STATE pragma are same
         * except that sync clause absent because we saw issue only in CaDynamics_E2 */
		lappendstr(defs_list, "\
\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\
\n#include <openacc.h>\
\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], nrn_ion_global_map[0:nrn_ion_global_map_size][0:ion_global_map_member_size], _nt[0:1] _thread_present_) if(_nt->compute_gpu)\")\
\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _nt[0:1], _ml[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\
\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\
\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_shadow_rhs[0:_nt->shadow_rhs_cnt], _vec_shadow_d[0:_nt->shadow_rhs_cnt], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1]) if(_nt->compute_gpu) async(stream_id)\")\
\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"acc parallel loop present(_pnt[0:_pnt_length], _nrb[0:1], _nt[0:1], nrn_threads[0:nrn_nthread]) if(_nt->compute_gpu) async(stream_id)\")\
\n#else\
\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"\")\
\n#endif\
\n \
\n#if !defined(LAYOUT)\
\n/* 1 means AoS, >1 means AoSoA, <= 0 means SOA */\
\n#define LAYOUT 1\
\n#endif\
\n#if LAYOUT >= 1\
\n#define _STRIDE LAYOUT\
\n#else\
\n#define _STRIDE _cntml_padded + _iml\
\n#endif\
\n");

       // if protect is used then do not enable vectorisation with ivdep like pragmas
       // mod2c doesn't have fine grain mechanism to check where PROTECT appears (e.g. via AST)
       // and hence just disable vectorisation at the top level (usage of PROTECT is/would be rare
       // and not critical in mod2c anyway)
       if (protect_include_) {
           extra_pragma_loop_arg = insertstr(defs_list, "\n#define _PRAGMA_FOR_VECTOR_LOOP_\n");
       } else {
           extra_pragma_loop_arg = insertstr(defs_list, "\n"
               "\n#if defined(__ICC) || defined(__INTEL_COMPILER) || defined(__INTEL_LLVM_COMPILER)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ivdep\")"
               "\n#elif defined(__IBMC__) || defined(__IBMCPP__)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ibm independent_loop\")"
               "\n#elif defined(__PGI)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"vector\")"
               "\n#elif defined(_CRAYC)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"_CRI ivdep\")"
               "\n#elif defined(__clang__)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"clang loop vectorize(enable)\")"
               "\n#elif defined(__GNUC__) || defined(__GNUG__)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"GCC ivdep\")"
               "\n#else"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_"
               "\n#endif // _PRAGMA_FOR_VECTOR_LOOP_\n");
       }

	}else{
		Lappendstr(defs_list, "\
\n#undef LAYOUT\
\n#define LAYOUT 1\
\n#define _STRIDE 1\
\n");
	}

	if (net_receive_buffering_) {
		Lappendstr(defs_list, "\
\n\
\n#if !defined(NET_RECEIVE_BUFFERING)\
\n#define NET_RECEIVE_BUFFERING 1\
\n#endif\
\n");
	}

#if 1
	/* for easier profiling, give distinct names to otherwise reused static names */
	sprintf(buf, "\n\
#define nrn_init _nrn_init_%s\n\
#define nrn_cur _nrn_cur_%s\n\
#define _nrn_current _nrn_current_%s\n\
#define nrn_jacob _nrn_jacob_%s\n\
#define nrn_state _nrn_state_%s\n\
#define initmodel initmodel_%s\n\
#define _net_receive _net_receive_%s\n\
#define _net_init _net_init_%s\n\
#define nrn_state_launcher nrn_state%s_launcher\n\
#define nrn_cur_launcher nrn_cur%s_launcher\n\
#define nrn_jacob_launcher nrn_jacob%s_launcher\
", suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix);
	Lappendstr(defs_list, buf);

	if (net_receive_buffering_) {
		sprintf(buf, "\
\n#if NET_RECEIVE_BUFFERING\
\n#define _net_buf_receive _net_buf_receive%s\
\nvoid _net_buf_receive(NrnThread*);\
\n#endif\
\n", suffix);
		Lappendstr(defs_list, buf);
	}

	if (watch_seen_) {
		sprintf(buf,
"\n#define _nrn_watch_check _nrn_watch_check_%s", suffix);
		Lappendstr(defs_list, buf);
	}

	SYMLISTITER {
		Symbol* s = SYM(q);
		/* note that with GLOBFUNCT, FUNCT will be redefined anyway */
		if (s->type == NAME && s->subtype & (PROCED | DERF | KINF)) {
			sprintf(buf, "\n#define %s %s%s", s->name, s->name, suffix);
			Lappendstr(defs_list, buf);
		}
	}
	Lappendstr(defs_list, "\n");
#endif /* distinct names for easier profiling */

	Lappendstr(defs_list, "\n\
#undef _threadargscomma_\n\
#undef _threadargsprotocomma_\n\
#undef _threadargs_\n\
#undef _threadargsproto_\n\
");
	if (vectorize) {
		Lappendstr(defs_list, "\n\
#define _threadargscomma_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v,\n\
#define _threadargsprotocomma_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v,\n\
#define _threadargs_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v\n\
#define _threadargsproto_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v\n\
");
}else{
		Lappendstr(defs_list, "\n\
#define _threadargscomma_ /**/\n\
#define _threadargsprotocomma_ /**/\n\
#define _threadargs_ /**/\n\
#define _threadargsproto_ /**/\n\
");
}

	Lappendstr(defs_list, "\
	/*SUPPRESS 761*/\n\
	/*SUPPRESS 762*/\n\
	/*SUPPRESS 763*/\n\
	/*SUPPRESS 765*/\n\
	");
#if VECTORIZE
    if (vectorize) {
	Sprintf(buf, "/* Thread safe. No static _p or _ppvar. */\n");
    }else
#endif
    {
	Sprintf(buf, "static double *_p; static Datum *_ppvar;\n");
    }
	Lappendstr(defs_list, buf);

	nrndeclare();
	varcount = parraycount = 0;
	declare_p();
	ioncount = iondef(&pointercount); /* first is _nd_area if point process */
	Lappendstr(defs_list, "\n#if MAC\n#if !defined(v)\n#define v _mlhv\n#endif\n#if !defined(h)\n#define h _mlhh\n#endif\n#endif\n");
	Lappendstr(defs_list, "static int hoc_nrnpointerindex = ");
	if (pointercount) {
		q = nrnpointers->next;
		Sprintf(buf, "%d;\n", SYM(q)->used);
	}else{
		Sprintf(buf, "-1;\n");
	}
	Lappendstr(defs_list, buf);
	/*above modified to also count and define pointers*/
	
	if (vectorize) {
		Lappendstr(defs_list, "static ThreadDatum* _extcall_thread;\n");
	}
#if 0
	Lappendstr(defs_list, "/* static variables special to NEURON */\n");
	SYMLISTITER {
		if (SYM(q)->nrntype & NRNSTATIC) {
			Sprintf(buf, "static double %s;\n", SYM(q)->name);
			Lappendstr(defs_list, buf);
		}
	}
#endif

	Lappendstr(defs_list, "/* external NEURON variables */\n");
	int add_celsius  = 0;
	int redefine_nrn_ghk = 0;
	SYMLISTITER {
		s = SYM(q);
		if(strcmp(s->name, "nrn_ghk") == 0 && s->subtype & EXTDEF) {
			add_celsius = 1;
			redefine_nrn_ghk = 1;
		}
		if (s->nrntype & NRNEXTRN) {
			if (strcmp(s->name, "celsius") == 0) {
				add_celsius = 1;
				continue;
			}
			if (strcmp(s->name, "dt") == 0) { continue; }
			if (strcmp(s->name, "t") == 0) { continue; }
			if (s->subtype & ARRAY) {
				Sprintf(buf, "extern double* %s;\n", s->name);
			}else{
				Sprintf(buf, "extern double %s;\n", s->name);
			}
			Lappendstr(defs_list, buf);
			// following are remaining two global variables used as extern from
			// coreneuron side and hence add them to global variable list.
			if (strcmp(s->name, "secondorder") || strcmp(s->name, "pi"))  {
				add_global_var("double", s->name, 0, 0, 0, 0);
            }
        }
    }